

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  byte bVar2;
  uchar uVar3;
  short sVar4;
  stbi_uc asVar5 [4];
  stbi_uc asVar6 [4];
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  byte bVar29;
  short sVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined4 z;
  undefined4 z_00;
  undefined4 z_01;
  stbi_uc sVar38;
  byte bVar39;
  int iVar40;
  stbi__uint32 sVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  uint uVar45;
  stbi__jpeg *psVar46;
  char *pcVar47;
  byte *pbVar48;
  byte *pbVar49;
  uchar *data_00;
  float *data_01;
  void *pvVar50;
  code *pcVar51;
  stbi__context *psVar52;
  stbi_uc *psVar53;
  uchar *puVar54;
  short sVar55;
  stbi_uc *psVar56;
  long lVar57;
  long lVar58;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  uint extraout_EDX_03;
  uint extraout_EDX_04;
  uint extraout_EDX_05;
  uint extraout_EDX_06;
  int extraout_EDX_07;
  uint uVar59;
  anon_struct_96_18_0d0905d3 *extraout_RDX;
  anon_struct_96_18_0d0905d3 *extraout_RDX_00;
  anon_struct_96_18_0d0905d3 *extraout_RDX_01;
  anon_struct_96_18_0d0905d3 *paVar60;
  ulong extraout_RDX_02;
  stbi_uc *extraout_RDX_03;
  stbi_uc *psVar61;
  stbi_uc *extraout_RDX_04;
  stbi_uc *extraout_RDX_05;
  int iVar62;
  short *psVar63;
  stbi_uc *psVar64;
  uint uVar65;
  ulong uVar66;
  stbi__uint32 sVar67;
  ulong uVar68;
  undefined4 in_register_00000084;
  stbi__result_info *ri_00;
  int iVar69;
  ulong uVar70;
  int *piVar71;
  int iVar72;
  ulong uVar73;
  uint uVar74;
  stbi_uc (*pasVar75) [4];
  stbi__context *psVar76;
  long in_FS_OFFSET;
  bool bVar77;
  undefined1 auVar78 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  stbi_uc *coutput [4];
  short data [64];
  ulong local_8990;
  uint local_8958;
  uint local_8944;
  uint local_8934;
  int local_8914;
  uint local_88fc;
  undefined1 local_88f8 [12];
  uint uStack_88ec;
  undefined1 local_88e8 [16];
  int local_88d8;
  undefined4 local_88d4;
  uint local_88d0;
  int local_88cc;
  anon_struct_96_18_0d0905d3 *local_88c8;
  stbi__jpeg *local_88c0;
  undefined8 local_88b8;
  stbi__uint32 local_88b0;
  int local_88ac;
  stbi__gif local_88a8;
  
  psVar61 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  ri_00 = ri;
  psVar46 = (stbi__jpeg *)malloc(0x4888);
  psVar46->s = s;
  psVar46->idct_block_kernel = stbi__idct_simd;
  psVar46->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar46->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  psVar46->jfif = 0;
  psVar46->app14_color_transform = -1;
  psVar46->marker = 0xff;
  sVar38 = stbi__get_marker(psVar46);
  if (sVar38 != 0xd8) {
    *(char **)(in_FS_OFFSET + -0x10) = "no SOI";
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar46);
  if (sVar38 == 0xd8) {
    psVar46 = (stbi__jpeg *)malloc(0x4888);
    psVar46->s = s;
    psVar46->idct_block_kernel = stbi__idct_simd;
    psVar46->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar46->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      psVar46->img_comp[0].raw_data = (void *)0x0;
      psVar46->img_comp[0].raw_coeff = (void *)0x0;
      psVar46->img_comp[1].raw_data = (void *)0x0;
      psVar46->img_comp[1].raw_coeff = (void *)0x0;
      psVar46->img_comp[2].raw_data = (void *)0x0;
      psVar46->img_comp[2].raw_coeff = (void *)0x0;
      psVar46->img_comp[3].raw_data = (void *)0x0;
      psVar46->img_comp[3].raw_coeff = (void *)0x0;
      psVar46->restart_interval = 0;
      iVar40 = stbi__decode_jpeg_header(psVar46,0);
      uVar74 = extraout_EDX;
      if (iVar40 != 0) {
        paVar1 = psVar46->img_comp;
        bVar39 = stbi__get_marker(psVar46);
LAB_00116668:
        if (bVar39 == 0xda) {
          iVar40 = stbi__get16be(psVar46->s);
          psVar52 = psVar46->s;
          pbVar49 = psVar52->img_buffer;
          paVar60 = extraout_RDX_00;
          if (psVar52->img_buffer_end <= pbVar49) {
            if (psVar52->read_from_callbacks != 0) {
              psVar61 = psVar52->buffer_start;
              iVar62 = (*(psVar52->io).read)(psVar52->io_user_data,(char *)psVar61,psVar52->buflen);
              if (iVar62 == 0) {
                psVar52->read_from_callbacks = 0;
                psVar64 = psVar52->buffer_start + 1;
                psVar52->buffer_start[0] = '\0';
                bVar39 = 0;
              }
              else {
                psVar64 = psVar61 + iVar62;
                bVar39 = *psVar61;
              }
              psVar52->img_buffer_end = psVar64;
              psVar52->img_buffer = psVar52->buffer_start + 1;
              paVar60 = extraout_RDX_01;
              goto LAB_0011674d;
            }
            psVar46->scan_n = 0;
LAB_00118350:
            pcVar47 = "bad SOS component count";
            goto LAB_00118357;
          }
          psVar52->img_buffer = pbVar49 + 1;
          bVar39 = *pbVar49;
LAB_0011674d:
          uVar74 = (uint)bVar39;
          psVar46->scan_n = uVar74;
          if (((byte)(bVar39 - 5) < 0xfc) || (psVar52 = psVar46->s, psVar52->img_n < (int)uVar74))
          goto LAB_00118350;
          if (iVar40 != uVar74 * 2 + 6) {
            pcVar47 = "bad SOS len";
            goto LAB_00118357;
          }
          lVar58 = 0;
          do {
            pbVar48 = psVar52->img_buffer;
            pbVar49 = psVar52->img_buffer_end;
            if (pbVar48 < pbVar49) {
              psVar52->img_buffer = pbVar48 + 1;
              uVar45 = (uint)*pbVar48;
              pbVar48 = pbVar48 + 1;
            }
            else if (psVar52->read_from_callbacks == 0) {
              uVar45 = 0;
            }
            else {
              psVar61 = psVar52->buffer_start;
              iVar40 = (*(psVar52->io).read)(psVar52->io_user_data,(char *)psVar61,psVar52->buflen);
              if (iVar40 == 0) {
                psVar52->read_from_callbacks = 0;
                psVar64 = psVar52->buffer_start + 1;
                psVar52->buffer_start[0] = '\0';
                uVar45 = 0;
              }
              else {
                psVar64 = psVar61 + iVar40;
                uVar45 = (uint)*psVar61;
              }
              psVar52->img_buffer_end = psVar64;
              psVar52->img_buffer = psVar52->buffer_start + 1;
              psVar52 = psVar46->s;
              pbVar48 = psVar52->img_buffer;
              pbVar49 = psVar52->img_buffer_end;
            }
            if (pbVar48 < pbVar49) {
              psVar52->img_buffer = pbVar48 + 1;
              uVar65 = (uint)*pbVar48;
            }
            else if (psVar52->read_from_callbacks == 0) {
              uVar65 = 0;
            }
            else {
              psVar61 = psVar52->buffer_start;
              iVar40 = (*(psVar52->io).read)(psVar52->io_user_data,(char *)psVar61,psVar52->buflen);
              if (iVar40 == 0) {
                psVar52->read_from_callbacks = 0;
                psVar64 = psVar52->buffer_start + 1;
                psVar52->buffer_start[0] = '\0';
                uVar65 = 0;
              }
              else {
                psVar64 = psVar61 + iVar40;
                uVar65 = (uint)*psVar61;
              }
              psVar52->img_buffer_end = psVar64;
              psVar52->img_buffer = psVar52->buffer_start + 1;
              psVar52 = psVar46->s;
            }
            uVar74 = psVar52->img_n;
            if ((long)(int)uVar74 < 1) {
              uVar66 = 0;
            }
            else {
              uVar66 = 0;
              paVar60 = paVar1;
              while (paVar60->id != uVar45) {
                uVar66 = uVar66 + 1;
                paVar60 = paVar60 + 1;
                if ((long)(int)uVar74 == uVar66) goto LAB_00118360;
              }
            }
            if ((uint)uVar66 == uVar74) goto LAB_00118360;
            uVar68 = uVar66 & 0xffffffff;
            paVar60 = (anon_struct_96_18_0d0905d3 *)(uVar68 * 0x60);
            psVar46->img_comp[uVar68].hd = uVar65 >> 4;
            if (0x3f < (byte)uVar65) {
              pcVar47 = "bad DC huff";
              goto LAB_00118357;
            }
            paVar60 = paVar1 + uVar68;
            paVar60->ha = uVar65 & 0xf;
            if (3 < (uVar65 & 0xf)) {
              pcVar47 = "bad AC huff";
              goto LAB_00118357;
            }
            psVar46->order[lVar58] = (uint)uVar66;
            lVar58 = lVar58 + 1;
          } while (lVar58 < psVar46->scan_n);
          pbVar49 = psVar52->img_buffer;
          pbVar48 = psVar52->img_buffer_end;
          if (pbVar49 < pbVar48) {
            psVar52->img_buffer = pbVar49 + 1;
            bVar39 = *pbVar49;
            pbVar49 = pbVar49 + 1;
          }
          else if (psVar52->read_from_callbacks == 0) {
            bVar39 = 0;
          }
          else {
            psVar61 = psVar52->buffer_start;
            iVar40 = (*(psVar52->io).read)(psVar52->io_user_data,(char *)psVar61,psVar52->buflen);
            if (iVar40 == 0) {
              psVar52->read_from_callbacks = 0;
              psVar64 = psVar52->buffer_start + 1;
              psVar52->buffer_start[0] = '\0';
              bVar39 = 0;
            }
            else {
              psVar64 = psVar61 + iVar40;
              bVar39 = *psVar61;
            }
            psVar52->img_buffer_end = psVar64;
            psVar52->img_buffer = psVar52->buffer_start + 1;
            psVar52 = psVar46->s;
            pbVar49 = psVar52->img_buffer;
            pbVar48 = psVar52->img_buffer_end;
          }
          psVar46->spec_start = (uint)bVar39;
          if (pbVar49 < pbVar48) {
            psVar52->img_buffer = pbVar49 + 1;
            uVar74 = (uint)*pbVar49;
            pbVar49 = pbVar49 + 1;
          }
          else if (psVar52->read_from_callbacks == 0) {
            uVar74 = 0;
          }
          else {
            psVar61 = psVar52->buffer_start;
            iVar40 = (*(psVar52->io).read)(psVar52->io_user_data,(char *)psVar61,psVar52->buflen);
            if (iVar40 == 0) {
              psVar52->read_from_callbacks = 0;
              psVar64 = psVar52->buffer_start + 1;
              psVar52->buffer_start[0] = '\0';
              uVar74 = 0;
            }
            else {
              psVar64 = psVar61 + iVar40;
              uVar74 = (uint)*psVar61;
            }
            psVar52->img_buffer_end = psVar64;
            psVar52->img_buffer = psVar52->buffer_start + 1;
            psVar52 = psVar46->s;
            pbVar49 = psVar52->img_buffer;
            pbVar48 = psVar52->img_buffer_end;
          }
          psVar46->spec_end = uVar74;
          if (pbVar49 < pbVar48) {
            psVar52->img_buffer = pbVar49 + 1;
            uVar74 = (uint)*pbVar49;
          }
          else if (psVar52->read_from_callbacks == 0) {
            uVar74 = 0;
          }
          else {
            psVar61 = psVar52->buffer_start;
            iVar40 = (*(psVar52->io).read)(psVar52->io_user_data,(char *)psVar61,psVar52->buflen);
            if (iVar40 == 0) {
              psVar52->read_from_callbacks = 0;
              psVar64 = psVar52->buffer_start + 1;
              psVar52->buffer_start[0] = '\0';
              uVar74 = 0;
            }
            else {
              psVar64 = psVar61 + iVar40;
              uVar74 = (uint)*psVar61;
            }
            psVar52->img_buffer_end = psVar64;
            psVar52->img_buffer = psVar52->buffer_start + 1;
          }
          psVar46->succ_high = uVar74 >> 4;
          uVar45 = uVar74 & 0xf;
          paVar60 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar45;
          psVar46->succ_low = uVar45;
          iVar40 = psVar46->progressive;
          iVar62 = psVar46->spec_start;
          if (iVar40 == 0) {
            if ((iVar62 != 0) || ((0xf < (byte)uVar74 || (uVar45 != 0)))) {
LAB_001194b3:
              pcVar47 = "bad SOS";
              goto LAB_00118357;
            }
            psVar46->spec_end = 0x3f;
          }
          else if ((((0x3f < iVar62) || (0x3f < psVar46->spec_end)) || (psVar46->spec_end < iVar62))
                  || ((0xdf < (byte)uVar74 || (0xd < uVar45)))) goto LAB_001194b3;
          uVar74 = psVar46->scan_n;
          uVar66 = (ulong)uVar74;
          iVar62 = psVar46->restart_interval;
          if (iVar62 == 0) {
            iVar62 = 0x7fffffff;
          }
          psVar46->code_buffer = 0;
          psVar46->code_bits = 0;
          psVar46->nomore = 0;
          psVar46->img_comp[3].dc_pred = 0;
          psVar46->img_comp[2].dc_pred = 0;
          psVar46->img_comp[1].dc_pred = 0;
          psVar46->img_comp[0].dc_pred = 0;
          psVar46->marker = 0xff;
          psVar46->todo = iVar62;
          psVar46->eob_run = 0;
          if (iVar40 == 0) {
            if (uVar74 == 1) {
              iVar40 = psVar46->order[0];
              iVar62 = psVar46->img_comp[iVar40].y + 7 >> 3;
              bVar77 = true;
              uVar74 = 1;
              if (0 < iVar62) {
                uVar45 = paVar1[iVar40].x + 7 >> 3;
                iVar42 = 0;
                iVar69 = 0;
                do {
                  if (0 < (int)uVar45) {
                    lVar58 = 0;
                    do {
                      iVar43 = stbi__jpeg_decode_block
                                         (psVar46,(short *)&local_88a8,
                                          (stbi__huffman *)psVar46->huff_dc[paVar1[iVar40].hd].fast,
                                          (stbi__huffman *)psVar46->huff_ac[paVar1[iVar40].ha].fast,
                                          psVar46->fast_ac[paVar1[iVar40].ha],iVar40,
                                          psVar46->dequant[paVar1[iVar40].tq]);
                      uVar74 = extraout_EDX_02;
                      if (iVar43 == 0) goto LAB_001179a9;
                      (*psVar46->idct_block_kernel)
                                (paVar1[iVar40].data + lVar58 + iVar42 * paVar1[iVar40].w2,
                                 paVar1[iVar40].w2,(short *)&local_88a8);
                      uVar74 = (uint)extraout_RDX_02;
                      iVar43 = psVar46->todo;
                      psVar46->todo = iVar43 + -1;
                      uVar66 = extraout_RDX_02;
                      if (iVar43 < 2) {
                        if (psVar46->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar46);
                          uVar74 = extraout_EDX_03;
                        }
                        if ((psVar46->marker & 0xf8) != 0xd0) goto LAB_001179a2;
                        psVar46->code_buffer = 0;
                        psVar46->code_bits = 0;
                        psVar46->nomore = 0;
                        psVar46->img_comp[3].dc_pred = 0;
                        psVar46->img_comp[2].dc_pred = 0;
                        psVar46->img_comp[1].dc_pred = 0;
                        psVar46->img_comp[0].dc_pred = 0;
                        psVar46->marker = 0xff;
                        iVar43 = psVar46->restart_interval;
                        uVar66 = 0x7fffffff;
                        if (iVar43 == 0) {
                          iVar43 = 0x7fffffff;
                        }
                        psVar46->todo = iVar43;
                        psVar46->eob_run = 0;
                      }
                      lVar58 = lVar58 + 8;
                    } while ((ulong)uVar45 * 8 != lVar58);
                  }
                  uVar74 = (uint)uVar66;
                  iVar69 = iVar69 + 1;
                  iVar42 = iVar42 + 8;
                } while (iVar69 != iVar62);
LAB_001179a2:
                bVar77 = true;
              }
            }
            else {
              uVar74 = psVar46->img_mcu_y;
              uVar66 = (ulong)uVar74;
              bVar77 = true;
              if (0 < (int)uVar74) {
                iVar40 = psVar46->img_mcu_x;
                iVar69 = 0;
                do {
                  if (0 < iVar40) {
                    uVar45 = 0;
                    do {
                      iVar40 = psVar46->scan_n;
                      if (0 < iVar40) {
                        uVar66 = 0;
                        do {
                          iVar62 = psVar46->order[uVar66];
                          iVar42 = psVar46->img_comp[iVar62].v;
                          if (0 < iVar42) {
                            iVar40 = paVar1[iVar62].h;
                            iVar43 = 0;
                            do {
                              if (0 < iVar40) {
                                iVar42 = 0;
                                do {
                                  iVar72 = paVar1[iVar62].v;
                                  iVar44 = stbi__jpeg_decode_block
                                                     (psVar46,(short *)&local_88a8,
                                                      (stbi__huffman *)
                                                      psVar46->huff_dc[paVar1[iVar62].hd].fast,
                                                      (stbi__huffman *)
                                                      psVar46->huff_ac[paVar1[iVar62].ha].fast,
                                                      psVar46->fast_ac[paVar1[iVar62].ha],iVar62,
                                                      psVar46->dequant[paVar1[iVar62].tq]);
                                  uVar74 = extraout_EDX_05;
                                  if (iVar44 == 0) goto LAB_001179a9;
                                  (*psVar46->idct_block_kernel)
                                            (paVar1[iVar62].data +
                                             (long)(int)((iVar40 * uVar45 + iVar42) * 8) +
                                             (long)((iVar72 * iVar69 + iVar43) * paVar1[iVar62].w2 *
                                                   8),paVar1[iVar62].w2,(short *)&local_88a8);
                                  iVar42 = iVar42 + 1;
                                  iVar40 = paVar1[iVar62].h;
                                } while (iVar42 < iVar40);
                                iVar42 = paVar1[iVar62].v;
                              }
                              iVar43 = iVar43 + 1;
                            } while (iVar43 < iVar42);
                            iVar40 = psVar46->scan_n;
                          }
                          uVar66 = uVar66 + 1;
                        } while ((long)uVar66 < (long)iVar40);
                        iVar62 = psVar46->todo;
                      }
                      uVar74 = (uint)uVar66;
                      psVar46->todo = iVar62 + -1;
                      bVar77 = iVar62 < 2;
                      iVar62 = iVar62 + -1;
                      if (bVar77) {
                        if (psVar46->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar46);
                          uVar74 = extraout_EDX_06;
                        }
                        if ((psVar46->marker & 0xf8) != 0xd0) goto LAB_001179a2;
                        psVar46->code_buffer = 0;
                        psVar46->code_bits = 0;
                        psVar46->nomore = 0;
                        psVar46->img_comp[3].dc_pred = 0;
                        psVar46->img_comp[2].dc_pred = 0;
                        psVar46->img_comp[1].dc_pred = 0;
                        psVar46->img_comp[0].dc_pred = 0;
                        psVar46->marker = 0xff;
                        iVar62 = psVar46->restart_interval;
                        if (iVar62 == 0) {
                          iVar62 = 0x7fffffff;
                        }
                        psVar46->todo = iVar62;
                        psVar46->eob_run = 0;
                      }
                      uVar45 = uVar45 + 1;
                      uVar66 = (ulong)uVar45;
                      iVar40 = psVar46->img_mcu_x;
                    } while ((int)uVar45 < iVar40);
                    uVar66 = (ulong)(uint)psVar46->img_mcu_y;
                  }
                  iVar69 = iVar69 + 1;
                  uVar74 = (uint)uVar66;
                } while (iVar69 < (int)uVar74);
                goto LAB_001179a2;
              }
            }
            goto LAB_001179ab;
          }
          if (uVar74 == 1) {
            local_88b8 = (ulong)psVar46->order[0];
            iVar40 = psVar46->img_comp[local_88b8].y + 7 >> 3;
            if (0 < iVar40) {
              local_88c8 = paVar1 + local_88b8;
              iVar62 = psVar46->img_comp[local_88b8].x + 7 >> 3;
              local_8944 = 0;
              do {
                if (0 < iVar62) {
                  iVar69 = 0;
                  do {
                    psVar63 = local_88c8->coeff +
                              (int)((local_88c8->coeff_w * local_8944 + iVar69) * 0x40);
                    uVar66 = (ulong)psVar46->spec_start;
                    if (uVar66 == 0) {
                      iVar42 = stbi__jpeg_decode_block_prog_dc
                                         (psVar46,psVar63,
                                          (stbi__huffman *)psVar46->huff_dc[local_88c8->hd].fast,
                                          (int)local_88b8);
                      uVar74 = extraout_EDX_01;
                      if (iVar42 == 0) goto LAB_00118360;
                    }
                    else {
                      iVar42 = local_88c8->ha;
                      iVar43 = psVar46->eob_run;
                      bVar39 = (byte)psVar46->succ_low;
                      if (psVar46->succ_high == 0) {
                        if (iVar43 == 0) {
                          paVar60 = (anon_struct_96_18_0d0905d3 *)(ulong)(uint)psVar46->code_bits;
                          do {
                            if ((int)paVar60 < 0x10) {
                              stbi__grow_buffer_unsafe(psVar46);
                            }
                            uVar74 = psVar46->code_buffer;
                            uVar68 = (ulong)(uVar74 >> 0x17);
                            sVar55 = psVar46->fast_ac[iVar42][uVar68];
                            uVar45 = (uint)sVar55;
                            iVar43 = (int)uVar66;
                            if (sVar55 == 0) {
                              if (psVar46->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(psVar46);
                                uVar74 = psVar46->code_buffer;
                                uVar68 = (ulong)(uVar74 >> 0x17);
                              }
                              uVar66 = (ulong)psVar46->huff_ac[iVar42].fast[uVar68];
                              if (uVar66 == 0xff) {
                                lVar58 = 0;
                                do {
                                  lVar57 = lVar58;
                                  lVar58 = lVar57 + 1;
                                } while (psVar46->huff_ac[iVar42].maxcode[lVar57 + 10] <=
                                         uVar74 >> 0x10);
                                uVar45 = psVar46->code_bits;
                                paVar60 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar45;
                                if (lVar58 == 8) goto LAB_00119f1c;
                                if ((int)uVar45 < (int)(lVar57 + 10)) goto LAB_00119f27;
                                uVar66 = (ulong)(int)((uVar74 >> (0x17U - (char)lVar58 & 0x1f) &
                                                      stbi__bmask[lVar57 + 10]) +
                                                     psVar46->huff_ac[iVar42].delta[lVar57 + 10]);
                                bVar2 = psVar46->huff_ac[iVar42].size[uVar66];
                                if ((uVar74 >> (-bVar2 & 0x1f) & stbi__bmask[bVar2]) !=
                                    (uint)psVar46->huff_ac[iVar42].code[uVar66]) goto LAB_00119f61;
                                uVar45 = (uVar45 - (int)lVar58) - 9;
                                paVar60 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar45;
                                psVar46->code_bits = uVar45;
                                sVar41 = uVar74 << ((byte)(lVar57 + 10) & 0x1f);
                                psVar46->code_buffer = sVar41;
                              }
                              else {
                                bVar2 = psVar46->huff_ac[iVar42].size[uVar66];
                                uVar45 = psVar46->code_bits - (uint)bVar2;
                                paVar60 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar45;
                                if (psVar46->code_bits < (int)(uint)bVar2) goto LAB_00119f27;
                                sVar41 = uVar74 << (bVar2 & 0x1f);
                                psVar46->code_buffer = sVar41;
                                psVar46->code_bits = uVar45;
                              }
                              bVar2 = psVar46->huff_ac[iVar42].values[uVar66];
                              uVar74 = bVar2 & 0xf;
                              bVar29 = bVar2 >> 4;
                              uVar45 = (uint)bVar29;
                              iVar72 = (int)paVar60;
                              if ((bVar2 & 0xf) == 0) {
                                if (bVar2 < 0xf0) {
                                  iVar43 = 1 << bVar29;
                                  psVar46->eob_run = iVar43;
                                  if (0xf < bVar2) {
                                    if (iVar72 < (int)uVar45) {
                                      stbi__grow_buffer_unsafe(psVar46);
                                      sVar41 = psVar46->code_buffer;
                                      iVar72 = psVar46->code_bits;
                                      iVar43 = psVar46->eob_run;
                                    }
                                    uVar65 = sVar41 << bVar29 | sVar41 >> 0x20 - bVar29;
                                    uVar74 = stbi__bmask[uVar45];
                                    psVar46->code_buffer = ~uVar74 & uVar65;
                                    iVar43 = iVar43 + (uVar65 & uVar74);
                                    psVar46->code_bits = iVar72 - uVar45;
                                  }
                                  goto LAB_00116d3e;
                                }
                                uVar74 = iVar43 + 0x10;
                              }
                              else {
                                lVar58 = (long)iVar43 + (ulong)uVar45;
                                bVar2 = ""[lVar58];
                                if (iVar72 < (int)uVar74) {
                                  stbi__grow_buffer_unsafe(psVar46);
                                  sVar41 = psVar46->code_buffer;
                                  iVar72 = psVar46->code_bits;
                                }
                                uVar65 = sVar41 << (sbyte)uVar74 | sVar41 >> 0x20 - (sbyte)uVar74;
                                uVar45 = *(uint *)((long)stbi__bmask + (ulong)(uVar74 * 4));
                                psVar46->code_buffer = ~uVar45 & uVar65;
                                paVar60 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar72 - uVar74);
                                psVar46->code_bits = iVar72 - uVar74;
                                iVar43 = 0;
                                if (-1 < (int)sVar41) {
                                  iVar43 = *(int *)((long)stbi__jbias + (ulong)(uVar74 * 4));
                                }
                                uVar74 = (int)lVar58 + 1;
                                psVar63[bVar2] =
                                     (short)((uVar65 & uVar45) + iVar43 << (bVar39 & 0x1f));
                              }
                            }
                            else {
                              lVar58 = (long)iVar43 + (ulong)(uVar45 >> 4 & 0xf);
                              psVar46->code_buffer = uVar74 << (sbyte)(uVar45 & 0xf);
                              uVar74 = psVar46->code_bits - (uVar45 & 0xf);
                              paVar60 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar74;
                              psVar46->code_bits = uVar74;
                              uVar74 = (int)lVar58 + 1;
                              psVar63[""[lVar58]] = (short)((uVar45 >> 8) << (bVar39 & 0x1f));
                            }
                            uVar66 = (ulong)uVar74;
                          } while ((int)uVar74 <= psVar46->spec_end);
                        }
                        else {
LAB_00116d3e:
                          psVar46->eob_run = iVar43 + -1;
                        }
                      }
                      else if (iVar43 == 0) {
                        iVar43 = 0x10000 << (bVar39 & 0x1f);
                        paVar60 = (anon_struct_96_18_0d0905d3 *)(ulong)(uint)psVar46->code_bits;
                        do {
                          if ((int)paVar60 < 0x10) {
                            stbi__grow_buffer_unsafe(psVar46);
                          }
                          uVar74 = psVar46->code_buffer;
                          uVar68 = (ulong)psVar46->huff_ac[iVar42].fast[uVar74 >> 0x17];
                          if (uVar68 == 0xff) {
                            lVar58 = 0;
                            do {
                              lVar57 = lVar58;
                              lVar58 = lVar57 + 1;
                            } while (psVar46->huff_ac[iVar42].maxcode[lVar57 + 10] <= uVar74 >> 0x10
                                    );
                            uVar45 = psVar46->code_bits;
                            paVar60 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar45;
                            if (lVar58 == 8) goto LAB_00119f1c;
                            if ((int)uVar45 < (int)(lVar57 + 10)) goto LAB_00119f27;
                            uVar68 = (ulong)(int)((uVar74 >> (0x17U - (char)lVar58 & 0x1f) &
                                                  stbi__bmask[lVar57 + 10]) +
                                                 psVar46->huff_ac[iVar42].delta[lVar57 + 10]);
                            bVar2 = psVar46->huff_ac[iVar42].size[uVar68];
                            if ((uVar74 >> (-bVar2 & 0x1f) & stbi__bmask[bVar2]) !=
                                (uint)psVar46->huff_ac[iVar42].code[uVar68]) {
LAB_00119f61:
                              __assert_fail("(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                                            ,
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/stb_image.h"
                                            ,0x7f2,
                                            "int stbi__jpeg_huff_decode(stbi__jpeg *, stbi__huffman *)"
                                           );
                            }
                            uVar45 = (uVar45 - (int)lVar58) - 9;
                            paVar60 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar45;
                            psVar46->code_bits = uVar45;
                            sVar41 = uVar74 << ((byte)(lVar57 + 10) & 0x1f);
                            psVar46->code_buffer = sVar41;
                          }
                          else {
                            bVar2 = psVar46->huff_ac[iVar42].size[uVar68];
                            uVar45 = psVar46->code_bits - (uint)bVar2;
                            paVar60 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar45;
                            if (psVar46->code_bits < (int)(uint)bVar2) goto LAB_00119f27;
                            sVar41 = uVar74 << (bVar2 & 0x1f);
                            psVar46->code_buffer = sVar41;
                            psVar46->code_bits = uVar45;
                          }
                          iVar72 = (int)paVar60;
                          bVar2 = psVar46->huff_ac[iVar42].values[uVar68];
                          bVar29 = bVar2 >> 4;
                          uVar74 = (uint)bVar29;
                          uVar68 = (ulong)uVar74;
                          if ((bVar2 & 0xf) == 1) {
                            if (iVar72 < 1) {
                              stbi__grow_buffer_unsafe(psVar46);
                              sVar41 = psVar46->code_buffer;
                              iVar72 = psVar46->code_bits;
                            }
                            sVar67 = sVar41 * 2;
                            psVar46->code_buffer = sVar67;
                            paVar60 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar72 - 1U);
                            sVar55 = (short)(((int)~sVar41 >> 0x1f | 1U) << (bVar39 & 0x1f));
                            psVar46->code_bits = iVar72 - 1U;
                          }
                          else {
                            if ((bVar2 & 0xf) != 0) goto LAB_00119f27;
                            if (bVar2 < 0xf0) {
                              uVar45 = ~(-1 << bVar29);
                              psVar46->eob_run = uVar45;
                              uVar70 = 0x40;
                              if (0xf < bVar2) {
                                if (iVar72 < (int)uVar74) {
                                  stbi__grow_buffer_unsafe(psVar46);
                                  sVar41 = psVar46->code_buffer;
                                  iVar72 = psVar46->code_bits;
                                  uVar45 = psVar46->eob_run;
                                }
                                uVar59 = sVar41 << bVar29 | sVar41 >> 0x20 - bVar29;
                                uVar65 = stbi__bmask[uVar68];
                                sVar67 = ~uVar65 & uVar59;
                                psVar46->code_buffer = sVar67;
                                paVar60 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar72 - uVar74);
                                psVar46->code_bits = iVar72 - uVar74;
                                psVar46->eob_run = (uVar59 & uVar65) + uVar45;
                                sVar55 = 0;
                                uVar68 = uVar70;
                                goto LAB_00116f61;
                              }
                            }
                            else {
                              uVar70 = 0xf;
                            }
                            sVar55 = 0;
                            uVar68 = uVar70;
                            sVar67 = sVar41;
                          }
LAB_00116f61:
                          uVar74 = psVar46->spec_end;
                          uVar70 = (ulong)uVar74;
                          if ((int)uVar66 <= (int)uVar74) {
                            uVar73 = (long)(int)uVar66;
                            do {
                              uVar74 = (uint)uVar70;
                              iVar72 = (int)paVar60;
                              bVar2 = ""[uVar73];
                              if (psVar63[bVar2] == 0) {
                                if ((int)uVar68 == 0) {
                                  uVar66 = (ulong)((int)uVar73 + 1);
                                  psVar63[bVar2] = sVar55;
                                  break;
                                }
                                uVar68 = (ulong)((int)uVar68 - 1);
                              }
                              else {
                                if (iVar72 < 1) {
                                  stbi__grow_buffer_unsafe(psVar46);
                                  sVar67 = psVar46->code_buffer;
                                  iVar72 = psVar46->code_bits;
                                }
                                sVar41 = sVar67 * 2;
                                psVar46->code_buffer = sVar41;
                                paVar60 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar72 - 1U);
                                psVar46->code_bits = iVar72 - 1U;
                                bVar77 = (int)sVar67 < 0;
                                sVar67 = sVar41;
                                if ((bVar77) &&
                                   (sVar4 = psVar63[bVar2], (iVar43 >> 0x10 & (int)sVar4) == 0)) {
                                  sVar30 = (short)((uint)iVar43 >> 0x10);
                                  if (sVar4 < 1) {
                                    sVar30 = -sVar30;
                                  }
                                  psVar63[bVar2] = sVar4 + sVar30;
                                }
                              }
                              uVar66 = uVar73 + 1;
                              uVar74 = psVar46->spec_end;
                              uVar70 = (ulong)(int)uVar74;
                              bVar77 = (long)uVar73 < (long)uVar70;
                              uVar73 = uVar66;
                            } while (bVar77);
                          }
                        } while ((int)uVar66 <= (int)uVar74);
                      }
                      else {
                        psVar46->eob_run = iVar43 + -1;
                        if (psVar46->spec_start <= psVar46->spec_end) {
                          uVar74 = (0x10000 << (bVar39 & 0x1f)) >> 0x10;
                          do {
                            bVar39 = ""[uVar66];
                            if (psVar63[bVar39] != 0) {
                              iVar42 = psVar46->code_bits;
                              if (iVar42 < 1) {
                                stbi__grow_buffer_unsafe(psVar46);
                                iVar42 = psVar46->code_bits;
                              }
                              sVar41 = psVar46->code_buffer;
                              psVar46->code_buffer = sVar41 * 2;
                              psVar46->code_bits = iVar42 + -1;
                              if (((int)sVar41 < 0) &&
                                 (sVar55 = psVar63[bVar39], (uVar74 & (int)sVar55) == 0)) {
                                uVar45 = -uVar74;
                                if (0 < sVar55) {
                                  uVar45 = uVar74;
                                }
                                psVar63[bVar39] = (short)uVar45 + sVar55;
                              }
                            }
                            bVar77 = (long)uVar66 < (long)psVar46->spec_end;
                            uVar66 = uVar66 + 1;
                          } while (bVar77);
                        }
                      }
                    }
                    iVar42 = psVar46->todo;
                    psVar46->todo = iVar42 + -1;
                    if (iVar42 < 2) {
                      if (psVar46->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar46);
                      }
                      bVar39 = psVar46->marker;
                      if ((bVar39 & 0xf8) != 0xd0) goto LAB_001179bb;
                      psVar46->code_buffer = 0;
                      psVar46->code_bits = 0;
                      psVar46->nomore = 0;
                      psVar46->img_comp[3].dc_pred = 0;
                      psVar46->img_comp[2].dc_pred = 0;
                      psVar46->img_comp[1].dc_pred = 0;
                      psVar46->img_comp[0].dc_pred = 0;
                      psVar46->marker = 0xff;
                      iVar42 = psVar46->restart_interval;
                      if (iVar42 == 0) {
                        iVar42 = 0x7fffffff;
                      }
                      psVar46->todo = iVar42;
                      psVar46->eob_run = 0;
                    }
                    iVar69 = iVar69 + 1;
                  } while (iVar69 != iVar62);
                }
                local_8944 = local_8944 + 1;
              } while (local_8944 != iVar40);
            }
          }
          else {
            iVar40 = psVar46->img_mcu_y;
            if (0 < iVar40) {
              iVar69 = psVar46->img_mcu_x;
              iVar42 = 0;
              do {
                if (0 < iVar69) {
                  iVar40 = 0;
                  do {
                    iVar69 = psVar46->scan_n;
                    if (0 < iVar69) {
                      lVar58 = 0;
                      do {
                        iVar62 = psVar46->order[lVar58];
                        iVar43 = psVar46->img_comp[iVar62].v;
                        if (0 < iVar43) {
                          iVar69 = paVar1[iVar62].h;
                          iVar72 = 0;
                          do {
                            if (0 < iVar69) {
                              iVar43 = 0;
                              do {
                                iVar69 = stbi__jpeg_decode_block_prog_dc
                                                   (psVar46,paVar1[iVar62].coeff +
                                                            (iVar69 * iVar40 + iVar43 +
                                                            (paVar1[iVar62].v * iVar42 + iVar72) *
                                                            paVar1[iVar62].coeff_w) * 0x40,
                                                    (stbi__huffman *)
                                                    psVar46->huff_dc[paVar1[iVar62].hd].fast,iVar62)
                                ;
                                uVar74 = extraout_EDX_04;
                                if (iVar69 == 0) goto LAB_00118360;
                                iVar43 = iVar43 + 1;
                                iVar69 = paVar1[iVar62].h;
                              } while (iVar43 < iVar69);
                              iVar43 = paVar1[iVar62].v;
                            }
                            iVar72 = iVar72 + 1;
                          } while (iVar72 < iVar43);
                          iVar69 = psVar46->scan_n;
                        }
                        lVar58 = lVar58 + 1;
                      } while (lVar58 < iVar69);
                      iVar62 = psVar46->todo;
                    }
                    psVar46->todo = iVar62 + -1;
                    bVar77 = iVar62 < 2;
                    iVar62 = iVar62 + -1;
                    if (bVar77) {
                      if (psVar46->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar46);
                      }
                      bVar39 = psVar46->marker;
                      if ((bVar39 & 0xf8) != 0xd0) goto LAB_001179bb;
                      psVar46->code_buffer = 0;
                      psVar46->code_bits = 0;
                      psVar46->nomore = 0;
                      psVar46->img_comp[3].dc_pred = 0;
                      psVar46->img_comp[2].dc_pred = 0;
                      psVar46->img_comp[1].dc_pred = 0;
                      psVar46->img_comp[0].dc_pred = 0;
                      psVar46->marker = 0xff;
                      iVar62 = psVar46->restart_interval;
                      if (iVar62 == 0) {
                        iVar62 = 0x7fffffff;
                      }
                      psVar46->todo = iVar62;
                      psVar46->eob_run = 0;
                    }
                    iVar40 = iVar40 + 1;
                    iVar69 = psVar46->img_mcu_x;
                  } while (iVar40 < iVar69);
                  iVar40 = psVar46->img_mcu_y;
                }
                iVar42 = iVar42 + 1;
              } while (iVar42 < iVar40);
            }
          }
          goto LAB_001179b3;
        }
        uVar74 = (uint)bVar39;
        if (uVar74 == 0xdc) {
          iVar40 = stbi__get16be(psVar46->s);
          sVar41 = stbi__get16be(psVar46->s);
          paVar60 = extraout_RDX;
          if (iVar40 == 4) {
            if (sVar41 == psVar46->s->img_y) goto LAB_001166be;
            pcVar47 = "bad DNL height";
          }
          else {
            pcVar47 = "bad DNL len";
          }
          goto LAB_00118357;
        }
        if (uVar74 == 0xd9) {
          psVar76 = psVar46->s;
          uVar74 = psVar76->img_n;
          if (psVar46->progressive == 0) goto LAB_001181f3;
          if (0 < (int)uVar74) {
            lVar58 = 0;
            do {
              iVar40 = psVar46->img_comp[lVar58].y + 7 >> 3;
              if (0 < iVar40) {
                uVar74 = paVar1[lVar58].x + 7 >> 3;
                iVar62 = 0;
                do {
                  if (0 < (int)uVar74) {
                    uVar66 = 0;
                    do {
                      psVar63 = paVar1[lVar58].coeff +
                                (paVar1[lVar58].coeff_w * iVar62 + (int)uVar66) * 0x40;
                      iVar69 = paVar1[lVar58].tq;
                      lVar57 = 0;
                      do {
                        psVar63[lVar57] = psVar63[lVar57] * psVar46->dequant[iVar69][lVar57];
                        lVar57 = lVar57 + 1;
                      } while (lVar57 != 0x40);
                      (*psVar46->idct_block_kernel)
                                (paVar1[lVar58].data +
                                 uVar66 * 8 + (long)(iVar62 * 8 * paVar1[lVar58].w2),
                                 paVar1[lVar58].w2,psVar63);
                      uVar66 = uVar66 + 1;
                    } while (uVar66 != uVar74);
                  }
                  iVar62 = iVar62 + 1;
                } while (iVar62 != iVar40);
                psVar76 = psVar46->s;
              }
              lVar58 = lVar58 + 1;
              uVar74 = psVar76->img_n;
            } while (lVar58 < (int)uVar74);
LAB_001181f3:
            uVar45 = (2 < (int)uVar74) + 1 + (uint)(2 < (int)uVar74);
            if (req_comp != 0) {
              uVar45 = req_comp;
            }
            if (uVar74 == 3) {
              bVar77 = true;
              uVar65 = 3;
              if (psVar46->rgb != 3) {
                uVar74 = 3;
                if (psVar46->app14_color_transform != 0) goto LAB_00118608;
                bVar77 = psVar46->jfif == 0;
              }
            }
            else {
LAB_00118608:
              uVar65 = uVar74;
              bVar77 = false;
            }
            uVar74 = 1;
            if (bVar77) {
              uVar74 = uVar65;
            }
            if (uVar65 != 3) {
              uVar74 = uVar65;
            }
            if (2 < (int)uVar45) {
              uVar74 = uVar65;
            }
            local_88e8 = (undefined1  [16])0x0;
            _local_88f8 = (undefined1  [16])0x0;
            sVar41 = psVar76->img_x;
            if (0 < (int)uVar74) {
              lVar58 = 0;
              while( true ) {
                pvVar50 = malloc((ulong)(sVar41 + 3));
                *(void **)((long)&psVar46->img_comp[0].linebuf + lVar58 * 2) = pvVar50;
                iVar40 = extraout_EDX_07;
                if (pvVar50 == (void *)0x0) break;
                uVar66 = (long)psVar46->img_h_max /
                         (long)*(int *)((long)&psVar46->img_comp[0].h + lVar58 * 2);
                iVar40 = (int)uVar66;
                *(int *)((long)(local_88a8.pal + -7) + lVar58) = iVar40;
                iVar62 = psVar46->img_v_max / *(int *)((long)&psVar46->img_comp[0].v + lVar58 * 2);
                *(int *)((long)(local_88a8.pal + -6) + lVar58) = iVar62;
                *(int *)((long)(local_88a8.pal + -4) + lVar58) = iVar62 >> 1;
                *(int *)((long)(local_88a8.pal + -5) + lVar58) =
                     (int)((ulong)((sVar41 - 1) + iVar40) / (uVar66 & 0xffffffff));
                *(undefined4 *)((long)(local_88a8.pal + -3) + lVar58) = 0;
                uVar7 = *(undefined8 *)((long)&psVar46->img_comp[0].data + lVar58 * 2);
                *(undefined8 *)((long)(local_88a8.pal + -9) + lVar58) = uVar7;
                *(undefined8 *)((long)(local_88a8.pal + -0xb) + lVar58) = uVar7;
                if (iVar40 == 2) {
                  pcVar51 = stbi__resample_row_h_2;
                  if (iVar62 != 1) {
                    if (iVar62 != 2) goto LAB_0011874a;
                    pcVar51 = psVar46->resample_row_hv_2_kernel;
                  }
                }
                else if (iVar40 == 1) {
                  pcVar51 = stbi__resample_row_generic;
                  if (iVar62 == 2) {
                    pcVar51 = stbi__resample_row_v_2;
                  }
                  if (iVar62 == 1) {
                    pcVar51 = resample_row_1;
                  }
                }
                else {
LAB_0011874a:
                  pcVar51 = stbi__resample_row_generic;
                }
                *(code **)((long)&((stbi__gif *)(local_88a8.pal + -0xd))->w + lVar58) = pcVar51;
                lVar58 = lVar58 + 0x30;
                if ((ulong)uVar74 * 0x30 == lVar58) goto LAB_00118766;
              }
LAB_00118e0d:
              stbi__free_jpeg_components(psVar46,uVar65,iVar40);
              pcVar47 = "outofmem";
              goto LAB_00116564;
            }
LAB_00118766:
            sVar67 = psVar76->img_y;
            psVar52 = (stbi__context *)stbi__malloc_mad3(uVar45,sVar41,sVar67,1);
            iVar40 = (int)extraout_RDX_03;
            if (psVar52 == (stbi__context *)0x0) goto LAB_00118e0d;
            if (sVar67 != 0) {
              paVar1 = psVar46->img_comp;
              iVar62 = 0;
              uVar65 = 0;
              psVar61 = extraout_RDX_03;
              local_88c0 = psVar46;
              do {
                sVar41 = psVar76->img_x;
                if (0 < (int)uVar74) {
                  pasVar75 = (stbi_uc (*) [4])&local_88a8.ratio;
                  uVar66 = 0;
                  piVar71 = &paVar1->y;
                  do {
                    asVar5 = pasVar75[-1];
                    asVar6 = pasVar75[-3];
                    iVar40 = (int)asVar6 >> 1;
                    auVar116 = (**(code **)(pasVar75 + -10))
                                         (*(stbi_uc **)(piVar71 + 10),
                                          *(undefined8 *)
                                           (*pasVar75 +
                                           ((ulong)(iVar40 <= (int)asVar5) << 3 | 0xffffffffffffffe0
                                           )),*(undefined8 *)
                                               (*pasVar75 +
                                               ((ulong)((int)asVar5 < iVar40) << 3 |
                                               0xffffffffffffffe0)),pasVar75[-2],pasVar75[-4]);
                    psVar61 = auVar116._8_8_;
                    *(long *)(local_88f8 + uVar66 * 8) = auVar116._0_8_;
                    pasVar75[-1] = (stbi_uc  [4])((int)asVar5 + 1);
                    if ((int)asVar6 <= (int)asVar5 + 1) {
                      pasVar75[-1] = (stbi_uc  [4])0x0;
                      *(stbi_uc **)(pasVar75 + -8) = *(stbi_uc **)(pasVar75 + -6);
                      asVar5 = *pasVar75;
                      *pasVar75 = (stbi_uc  [4])((int)asVar5 + 1);
                      if ((int)asVar5 + 1 < *piVar71) {
                        *(stbi_uc **)(pasVar75 + -6) = *(stbi_uc **)(pasVar75 + -6) + piVar71[1];
                      }
                    }
                    uVar66 = uVar66 + 1;
                    piVar71 = piVar71 + 0x18;
                    pasVar75 = pasVar75 + 0xc;
                  } while (uVar74 != uVar66);
                }
                psVar46 = local_88c0;
                if ((int)uVar45 < 3) {
                  psVar76 = local_88c0->s;
                  if (bVar77) {
                    if (uVar45 == 1) {
                      if (psVar76->img_x != 0) {
                        uVar66 = 0;
                        do {
                          bVar39 = *(byte *)(local_88e8._0_8_ + uVar66);
                          psVar52->buffer_start[uVar66 + sVar41 * iVar62 + -0x38] =
                               (stbi_uc)((uint)bVar39 * 2 + ((uint)bVar39 + (uint)bVar39 * 8) * 3 +
                                         (uint)stack0xffffffffffff7710[uVar66] * 0x96 +
                                         (uint)*(byte *)(local_88f8._0_8_ + uVar66) * 0x4d >> 8);
                          uVar66 = uVar66 + 1;
                          psVar61 = (stbi_uc *)local_88e8._0_8_;
                        } while (uVar66 < psVar76->img_x);
                      }
                    }
                    else if (psVar76->img_x != 0) {
                      uVar66 = 0;
                      do {
                        bVar39 = *(byte *)(local_88e8._0_8_ + uVar66);
                        psVar52->buffer_start[uVar66 * 2 + (ulong)(sVar41 * iVar62) + -0x38] =
                             (stbi_uc)((uint)bVar39 * 2 + ((uint)bVar39 + (uint)bVar39 * 8) * 3 +
                                       (uint)stack0xffffffffffff7710[uVar66] * 0x96 +
                                       (uint)*(byte *)(local_88f8._0_8_ + uVar66) * 0x4d >> 8);
                        psVar52->buffer_start[uVar66 * 2 + (ulong)(sVar41 * iVar62) + -0x37] = 0xff;
                        uVar66 = uVar66 + 1;
                        psVar61 = (stbi_uc *)local_88e8._0_8_;
                      } while (uVar66 < psVar76->img_x);
                    }
                  }
                  else if (psVar76->img_n == 4) {
                    if (local_88c0->app14_color_transform == 2) {
                      if (psVar76->img_x != 0) {
                        psVar64 = psVar52->buffer_start + ((ulong)(sVar41 * iVar62) - 0x37);
                        psVar61 = (stbi_uc *)0x0;
                        do {
                          iVar40 = (*(byte *)(local_88f8._0_8_ + (long)psVar61) ^ 0xff) *
                                   (uint)psVar61[local_88e8._8_8_];
                          psVar64[-1] = (char)((iVar40 + 0x80U >> 8) + iVar40 + 0x80 >> 8);
                          *psVar64 = 0xff;
                          psVar61 = psVar61 + 1;
                          psVar64 = psVar64 + uVar45;
                        } while (psVar61 < (stbi_uc *)(ulong)psVar76->img_x);
                      }
                    }
                    else {
                      if (local_88c0->app14_color_transform != 0) goto LAB_00118bb6;
                      if (psVar76->img_x != 0) {
                        psVar64 = psVar52->buffer_start + ((ulong)(sVar41 * iVar62) - 0x37);
                        uVar66 = 0;
                        do {
                          bVar39 = *(byte *)(local_88e8._8_8_ + uVar66);
                          iVar40 = (uint)*(byte *)(local_88f8._0_8_ + uVar66) * (uint)bVar39;
                          iVar69 = (uint)stack0xffffffffffff7710[uVar66] * (uint)bVar39;
                          psVar64[-1] = (char)((((uint)*(byte *)(local_88e8._0_8_ + uVar66) *
                                                 (uint)bVar39 + 0x80 >> 8) +
                                                (uint)*(byte *)(local_88e8._0_8_ + uVar66) *
                                                (uint)bVar39 + 0x80 >> 8) * 0x1d +
                                               (iVar69 + (iVar69 + 0x80U >> 8) + 0x80 >> 8) * 0x96 +
                                               (iVar40 + (iVar40 + 0x80U >> 8) + 0x80 >> 8) * 0x4d
                                              >> 8);
                          *psVar64 = 0xff;
                          uVar66 = uVar66 + 1;
                          psVar64 = psVar64 + uVar45;
                          psVar61 = stack0xffffffffffff7710;
                        } while (uVar66 < psVar76->img_x);
                      }
                    }
                  }
                  else {
LAB_00118bb6:
                    if (uVar45 == 1) {
                      if (psVar76->img_x != 0) {
                        psVar64 = (stbi_uc *)0x0;
                        do {
                          (psVar52->buffer_start + ((ulong)(sVar41 * iVar62) - 0x38))[(long)psVar64]
                               = *(stbi_uc *)(local_88f8._0_8_ + (long)psVar64);
                          psVar64 = psVar64 + 1;
                          psVar61 = (stbi_uc *)(ulong)psVar76->img_x;
                        } while (psVar64 < (stbi_uc *)(ulong)psVar76->img_x);
                      }
                    }
                    else if (psVar76->img_x != 0) {
                      psVar64 = (stbi_uc *)0x0;
                      do {
                        psVar52->buffer_start[(long)psVar64 * 2 + (ulong)(sVar41 * iVar62) + -0x38]
                             = *(stbi_uc *)(local_88f8._0_8_ + (long)psVar64);
                        psVar52->buffer_start[(long)psVar64 * 2 + (ulong)(sVar41 * iVar62) + -0x37]
                             = 0xff;
                        psVar64 = psVar64 + 1;
                        psVar61 = (stbi_uc *)(ulong)psVar76->img_x;
                      } while (psVar64 < (stbi_uc *)(ulong)psVar76->img_x);
                    }
                  }
                }
                else {
                  psVar76 = local_88c0->s;
                  if (psVar76->img_n == 3) {
                    if (bVar77) {
                      if (psVar76->img_x != 0) {
                        psVar64 = psVar52->buffer_start + ((ulong)(sVar41 * iVar62) - 0x35);
                        psVar61 = (stbi_uc *)0x0;
                        do {
                          psVar64[-3] = *(stbi_uc *)(local_88f8._0_8_ + (long)psVar61);
                          psVar64[-2] = stack0xffffffffffff7710[(long)psVar61];
                          psVar64[-1] = *(stbi_uc *)(local_88e8._0_8_ + (long)psVar61);
                          *psVar64 = 0xff;
                          psVar61 = psVar61 + 1;
                          psVar64 = psVar64 + uVar45;
                        } while (psVar61 < (stbi_uc *)(ulong)psVar76->img_x);
                      }
                    }
                    else {
LAB_00118c2b:
                      (*local_88c0->YCbCr_to_RGB_kernel)
                                (psVar52->buffer_start + ((ulong)(uVar65 * uVar45 * sVar41) - 0x38),
                                 (stbi_uc *)local_88f8._0_8_,stack0xffffffffffff7710,
                                 (stbi_uc *)local_88e8._0_8_,psVar76->img_x,uVar45);
                      psVar76 = psVar46->s;
                      psVar61 = extraout_RDX_04;
                    }
                  }
                  else if (psVar76->img_n == 4) {
                    if (local_88c0->app14_color_transform == 2) {
                      (*local_88c0->YCbCr_to_RGB_kernel)
                                (psVar52->buffer_start + ((ulong)(uVar65 * uVar45 * sVar41) - 0x38),
                                 (stbi_uc *)local_88f8._0_8_,stack0xffffffffffff7710,
                                 (stbi_uc *)local_88e8._0_8_,psVar76->img_x,uVar45);
                      psVar76 = psVar46->s;
                      psVar61 = extraout_RDX_05;
                      if (psVar76->img_x != 0) {
                        psVar64 = psVar52->buffer_start + ((ulong)(sVar41 * iVar62) - 0x36);
                        uVar66 = 0;
                        do {
                          bVar39 = *(byte *)(local_88e8._8_8_ + uVar66);
                          iVar40 = (psVar64[-2] ^ 0xff) * (uint)bVar39;
                          psVar64[-2] = (byte)((iVar40 + 0x80U >> 8) + iVar40 + 0x80 >> 8);
                          iVar40 = (psVar64[-1] ^ 0xff) * (uint)bVar39;
                          psVar64[-1] = (byte)(iVar40 + (iVar40 + 0x80U >> 8) + 0x80 >> 8);
                          iVar40 = (*psVar64 ^ 0xff) * (uint)bVar39;
                          uVar59 = iVar40 + 0x80U >> 8;
                          *psVar64 = (byte)(iVar40 + uVar59 + 0x80 >> 8);
                          uVar66 = uVar66 + 1;
                          psVar64 = psVar64 + uVar45;
                          psVar61 = (stbi_uc *)(ulong)uVar59;
                        } while (uVar66 < psVar76->img_x);
                      }
                    }
                    else {
                      if (local_88c0->app14_color_transform != 0) goto LAB_00118c2b;
                      if (psVar76->img_x != 0) {
                        psVar64 = psVar52->buffer_start + ((ulong)(sVar41 * iVar62) - 0x35);
                        uVar66 = 0;
                        do {
                          bVar39 = *(byte *)(local_88e8._8_8_ + uVar66);
                          iVar40 = (uint)*(byte *)(local_88f8._0_8_ + uVar66) * (uint)bVar39;
                          psVar64[-3] = (char)((iVar40 + 0x80U >> 8) + iVar40 + 0x80 >> 8);
                          iVar40 = (uint)stack0xffffffffffff7710[uVar66] * (uint)bVar39;
                          psVar64[-2] = (char)(iVar40 + (iVar40 + 0x80U >> 8) + 0x80 >> 8);
                          psVar64[-1] = (char)((uint)*(byte *)(local_88e8._0_8_ + uVar66) *
                                               (uint)bVar39 +
                                               ((uint)*(byte *)(local_88e8._0_8_ + uVar66) *
                                                (uint)bVar39 + 0x80 >> 8) + 0x80 >> 8);
                          *psVar64 = 0xff;
                          uVar66 = uVar66 + 1;
                          psVar64 = psVar64 + uVar45;
                          psVar61 = (stbi_uc *)local_88e8._0_8_;
                        } while (uVar66 < psVar76->img_x);
                      }
                    }
                  }
                  else if (psVar76->img_x != 0) {
                    psVar64 = psVar52->buffer_start + ((ulong)(sVar41 * iVar62) - 0x35);
                    uVar66 = 0;
                    do {
                      sVar38 = *(stbi_uc *)(local_88f8._0_8_ + uVar66);
                      psVar64[-1] = sVar38;
                      psVar64[-2] = sVar38;
                      psVar64[-3] = sVar38;
                      *psVar64 = 0xff;
                      uVar66 = uVar66 + 1;
                      psVar64 = psVar64 + uVar45;
                    } while (uVar66 < psVar76->img_x);
                  }
                }
                iVar40 = (int)psVar61;
                uVar65 = uVar65 + 1;
                iVar62 = iVar62 + uVar45;
              } while (uVar65 < psVar76->img_y);
              uVar65 = psVar76->img_n;
            }
            stbi__free_jpeg_components(psVar46,uVar65,iVar40);
            psVar76 = psVar46->s;
            *x = psVar76->img_x;
            *y = psVar76->img_y;
            if (comp != (int *)0x0) {
              *comp = (uint)(2 < psVar76->img_n) * 2 + 1;
            }
            goto LAB_00118375;
          }
          uVar45 = req_comp + (uint)(req_comp == 0);
          goto LAB_00118608;
        }
        iVar40 = stbi__process_marker(psVar46,uVar74);
        uVar74 = extraout_EDX_00;
        if (iVar40 != 0) goto LAB_001166be;
      }
LAB_00118360:
      stbi__free_jpeg_components(psVar46,psVar46->s->img_n,uVar74);
    }
    else {
      pcVar47 = "bad req_comp";
LAB_00116564:
      *(char **)(in_FS_OFFSET + -0x10) = pcVar47;
    }
    psVar52 = (stbi__context *)0x0;
LAB_00118375:
    free(psVar46);
  }
  else {
    iVar40 = stbi__check_png_header(s);
    psVar56 = s->img_buffer_original;
    psVar64 = s->img_buffer_original_end;
    s->img_buffer = psVar56;
    s->img_buffer_end = psVar64;
    if (iVar40 == 0) {
      if (psVar56 < psVar64) {
        psVar53 = psVar56 + 1;
        s->img_buffer = psVar53;
        sVar38 = *psVar56;
LAB_00117bd8:
        if (sVar38 != 'B') goto LAB_00117def;
        if (psVar53 < psVar64) {
          s->img_buffer = psVar53 + 1;
          sVar38 = *psVar53;
        }
        else {
          if (s->read_from_callbacks == 0) goto LAB_00117def;
          psVar64 = s->buffer_start;
          iVar40 = (*(s->io).read)(s->io_user_data,(char *)psVar64,s->buflen);
          if (iVar40 == 0) {
            s->read_from_callbacks = 0;
            psVar56 = s->buffer_start + 1;
            s->buffer_start[0] = '\0';
            sVar38 = '\0';
          }
          else {
            psVar56 = psVar64 + iVar40;
            sVar38 = *psVar64;
          }
          s->img_buffer_end = psVar56;
          s->img_buffer = s->buffer_start + 1;
        }
        if (sVar38 != 'M') goto LAB_00117def;
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        uVar74 = stbi__get16le(s);
        iVar40 = stbi__get16le(s);
        uVar74 = iVar40 << 0x10 | uVar74;
        if (((0x38 < uVar74) || ((0x100010000001000U >> ((ulong)uVar74 & 0x3f) & 1) == 0)) &&
           (uVar74 != 0x6c)) {
          s->img_buffer = s->img_buffer_original;
          s->img_buffer_end = s->img_buffer_original_end;
          if (uVar74 == 0x7c) goto LAB_00117d26;
          goto LAB_00117e01;
        }
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
LAB_00117d26:
        local_88e8._12_4_ = 0xff;
        pvVar50 = stbi__bmp_parse_header(s,(stbi__bmp_data *)local_88f8);
        if (pvVar50 == (void *)0x0) goto LAB_001165c3;
        local_88b0 = s->img_y;
        sVar41 = -local_88b0;
        if (0 < (int)local_88b0) {
          sVar41 = local_88b0;
        }
        s->img_y = sVar41;
        local_88c0 = (stbi__jpeg *)CONCAT44(local_88c0._4_4_,uStack_88ec);
        z = local_88e8._0_4_;
        z_00 = local_88e8._4_4_;
        z_01 = local_88e8._8_4_;
        uVar74 = local_88e8._12_4_;
        if (local_88f8._8_4_ == 0xc) {
          if (0x17 < (int)local_88f8._0_4_) goto LAB_00117f7b;
          uVar45 = ((local_88f8._4_4_ - local_88d8) + -0x18) / 3;
LAB_00117f63:
          local_8990 = (ulong)uVar45;
          if (uVar45 == 0) goto LAB_00117f7b;
          bVar31 = false;
LAB_00117fd4:
          bVar77 = local_88e8._8_4_ == 0xff000000;
          iVar40 = 4 - (uint)(local_88e8._8_4_ == 0);
          iVar62 = local_88f8._0_4_;
        }
        else {
          if ((int)local_88f8._0_4_ < 0x10) {
            uVar45 = local_88f8._4_4_ - (local_88d8 + local_88f8._8_4_) >> 2;
            goto LAB_00117f63;
          }
LAB_00117f7b:
          if (s->img_buffer + (-0x38 - (long)s) != (stbi_uc *)(long)(int)local_88f8._4_4_) {
            __assert_fail("info.offset == (s->img_buffer - s->buffer_start)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/stb_image.h"
                          ,0x14cf,
                          "void *stbi__bmp_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                         );
          }
          local_8990 = 0;
          bVar77 = true;
          bVar31 = bVar77;
          if (local_88f8._0_4_ != 0x18 || local_88e8._8_4_ != 0xff000000) goto LAB_00117fd4;
          iVar40 = 3;
          iVar62 = 0x18;
          bVar31 = true;
        }
        s->img_n = iVar40;
        if (2 < req_comp) {
          iVar40 = req_comp;
        }
        sVar67 = s->img_x;
        iVar69 = stbi__mad3sizes_valid(iVar40,sVar67,sVar41,0);
        if (iVar69 == 0) {
          pcVar47 = "too large";
        }
        else {
          data_00 = (uchar *)stbi__malloc_mad3(iVar40,sVar67,sVar41,0);
          if (data_00 != (uchar *)0x0) {
            if (iVar62 < 0x10) {
              iVar69 = (int)local_8990;
              if (bVar31 || 0x100 < iVar69) {
                free(data_00);
                pcVar47 = "invalid";
                goto LAB_001165ba;
              }
              if (0 < iVar69) {
                psVar61 = s->buffer_start;
                psVar64 = s->buffer_start + 1;
                psVar56 = s->img_buffer;
                psVar53 = s->img_buffer_end;
                uVar66 = 0;
                do {
                  if (psVar56 < psVar53) {
                    s->img_buffer = psVar56 + 1;
                    sVar38 = *psVar56;
                    psVar56 = psVar56 + 1;
                  }
                  else if (s->read_from_callbacks == 0) {
                    sVar38 = '\0';
                  }
                  else {
                    iVar42 = (*(s->io).read)(s->io_user_data,(char *)psVar61,s->buflen);
                    if (iVar42 == 0) {
                      s->read_from_callbacks = 0;
                      s->buffer_start[0] = '\0';
                      sVar38 = '\0';
                      psVar53 = psVar64;
                    }
                    else {
                      sVar38 = *psVar61;
                      psVar53 = psVar61 + iVar42;
                    }
                    s->img_buffer_end = psVar53;
                    s->img_buffer = psVar64;
                    psVar56 = psVar64;
                  }
                  local_88a8.pal[uVar66 - 0xd][2] = sVar38;
                  if (psVar56 < psVar53) {
                    s->img_buffer = psVar56 + 1;
                    sVar38 = *psVar56;
                    psVar56 = psVar56 + 1;
                  }
                  else if (s->read_from_callbacks == 0) {
                    sVar38 = '\0';
                  }
                  else {
                    iVar42 = (*(s->io).read)(s->io_user_data,(char *)psVar61,s->buflen);
                    if (iVar42 == 0) {
                      s->read_from_callbacks = 0;
                      s->buffer_start[0] = '\0';
                      sVar38 = '\0';
                      psVar53 = psVar64;
                    }
                    else {
                      sVar38 = *psVar61;
                      psVar53 = psVar61 + iVar42;
                    }
                    s->img_buffer_end = psVar53;
                    s->img_buffer = psVar64;
                    psVar56 = psVar64;
                  }
                  local_88a8.pal[uVar66 - 0xd][1] = sVar38;
                  if (psVar56 < psVar53) {
                    s->img_buffer = psVar56 + 1;
                    sVar38 = *psVar56;
                    psVar56 = psVar56 + 1;
                  }
                  else if (s->read_from_callbacks == 0) {
                    sVar38 = '\0';
                  }
                  else {
                    iVar42 = (*(s->io).read)(s->io_user_data,(char *)psVar61,s->buflen);
                    if (iVar42 == 0) {
                      s->read_from_callbacks = 0;
                      s->buffer_start[0] = '\0';
                      sVar38 = '\0';
                      psVar53 = psVar64;
                    }
                    else {
                      sVar38 = *psVar61;
                      psVar53 = psVar61 + iVar42;
                    }
                    s->img_buffer_end = psVar53;
                    s->img_buffer = psVar64;
                    psVar56 = psVar64;
                  }
                  local_88a8.pal[uVar66 - 0xd][0] = sVar38;
                  if (local_88f8._8_4_ != 0xc) {
                    if (psVar56 < psVar53) {
                      psVar56 = psVar56 + 1;
                    }
                    else {
                      if (s->read_from_callbacks == 0) goto LAB_00118549;
                      iVar42 = (*(s->io).read)(s->io_user_data,(char *)psVar61,s->buflen);
                      if (iVar42 == 0) {
                        s->read_from_callbacks = 0;
                        s->buffer_start[0] = '\0';
                        psVar53 = psVar64;
                      }
                      else {
                        psVar53 = psVar61 + iVar42;
                      }
                      s->img_buffer_end = psVar53;
                      psVar56 = psVar64;
                    }
                    s->img_buffer = psVar56;
                  }
LAB_00118549:
                  local_88a8.pal[uVar66 - 0xd][3] = 0xff;
                  uVar66 = uVar66 + 1;
                } while (local_8990 != uVar66);
              }
              stbi__skip(s,(iVar69 * (local_88f8._8_4_ == 0xc | 0xfffffffc) + local_88f8._4_4_) -
                           (local_88f8._8_4_ + local_88d8));
              if (iVar62 == 1) {
                sVar41 = s->img_y;
                if (0 < (int)sVar41) {
                  local_8958 = -(s->img_x + 7 >> 3) & 3;
                  psVar61 = s->buffer_start;
                  psVar64 = s->buffer_start + 1;
                  iVar62 = 0;
                  iVar69 = 0;
                  do {
                    psVar56 = s->img_buffer;
                    psVar53 = s->img_buffer_end;
                    if (psVar56 < psVar53) {
                      s->img_buffer = psVar56 + 1;
                      bVar39 = *psVar56;
                      psVar56 = psVar56 + 1;
                    }
                    else if (s->read_from_callbacks == 0) {
                      bVar39 = 0;
                    }
                    else {
                      iVar42 = (*(s->io).read)(s->io_user_data,(char *)psVar61,s->buflen);
                      if (iVar42 == 0) {
                        s->read_from_callbacks = 0;
                        s->buffer_start[0] = '\0';
                        bVar39 = 0;
                        psVar53 = psVar64;
                      }
                      else {
                        bVar39 = *psVar61;
                        psVar53 = psVar61 + iVar42;
                      }
                      s->img_buffer_end = psVar53;
                      s->img_buffer = psVar64;
                      psVar56 = psVar64;
                    }
                    sVar41 = s->img_x;
                    if (0 < (int)sVar41) {
                      uVar45 = (uint)bVar39;
                      sVar67 = 0;
                      uVar65 = 7;
                      do {
                        uVar66 = (ulong)((uVar45 >> (uVar65 & 0x1f) & 1) != 0);
                        data_00[iVar62] = local_88a8.pal[uVar66 - 0xd][0];
                        data_00[(long)iVar62 + 1] = local_88a8.pal[uVar66 - 0xd][1];
                        data_00[(long)iVar62 + 2] = local_88a8.pal[uVar66 - 0xd][2];
                        iVar42 = iVar62 + 3;
                        if (iVar40 == 4) {
                          data_00[(long)iVar62 + 3] = 0xff;
                          iVar42 = iVar62 + 4;
                        }
                        iVar62 = iVar42;
                        sVar67 = sVar67 + 1;
                        if (sVar67 == sVar41) break;
                        if ((int)uVar65 < 1) {
                          if (psVar56 < psVar53) {
                            s->img_buffer = psVar56 + 1;
                            uVar45 = (uint)*psVar56;
                            psVar56 = psVar56 + 1;
                          }
                          else if (s->read_from_callbacks == 0) {
                            uVar45 = 0;
                          }
                          else {
                            iVar42 = (*(s->io).read)(s->io_user_data,(char *)psVar61,s->buflen);
                            if (iVar42 == 0) {
                              s->read_from_callbacks = 0;
                              s->buffer_start[0] = '\0';
                              uVar45 = 0;
                              psVar53 = psVar64;
                            }
                            else {
                              uVar45 = (uint)*psVar61;
                              psVar53 = psVar61 + iVar42;
                            }
                            s->img_buffer_end = psVar53;
                            s->img_buffer = psVar64;
                            sVar41 = s->img_x;
                            psVar56 = psVar64;
                          }
                          uVar65 = 7;
                        }
                        else {
                          uVar65 = uVar65 - 1;
                        }
                      } while ((int)sVar67 < (int)sVar41);
                    }
                    stbi__skip(s,local_8958);
                    iVar69 = iVar69 + 1;
                    sVar41 = s->img_y;
                  } while (iVar69 < (int)sVar41);
                }
              }
              else {
                if (iVar62 == 8) {
                  uVar45 = s->img_x;
                }
                else {
                  if (iVar62 != 4) {
                    free(data_00);
                    pcVar47 = "bad bpp";
                    goto LAB_001165ba;
                  }
                  uVar45 = s->img_x + 1 >> 1;
                }
                sVar41 = s->img_y;
                if (0 < (int)sVar41) {
                  local_8990._0_4_ = -uVar45 & 3;
                  psVar61 = s->buffer_start;
                  psVar64 = s->buffer_start + 1;
                  uVar66 = 0;
                  iVar69 = 0;
                  do {
                    if (0 < (int)s->img_x) {
                      psVar56 = s->img_buffer;
                      psVar53 = s->img_buffer_end;
                      iVar42 = 0;
                      do {
                        if (psVar56 < psVar53) {
                          s->img_buffer = psVar56 + 1;
                          bVar39 = *psVar56;
                          psVar56 = psVar56 + 1;
                        }
                        else if (s->read_from_callbacks == 0) {
                          bVar39 = 0;
                        }
                        else {
                          iVar43 = (*(s->io).read)(s->io_user_data,(char *)psVar61,s->buflen);
                          if (iVar43 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            bVar39 = 0;
                            psVar53 = psVar64;
                          }
                          else {
                            bVar39 = *psVar61;
                            psVar53 = psVar61 + iVar43;
                          }
                          s->img_buffer_end = psVar53;
                          s->img_buffer = psVar64;
                          psVar56 = psVar64;
                        }
                        uVar65 = bVar39 & 0xf;
                        uVar45 = (uint)(bVar39 >> 4);
                        if (iVar62 != 4) {
                          uVar45 = (uint)bVar39;
                        }
                        uVar68 = (ulong)uVar45;
                        if (iVar62 != 4) {
                          uVar65 = 0;
                        }
                        lVar58 = (long)(int)uVar66;
                        uVar70 = lVar58 + 3;
                        data_00[lVar58] = local_88a8.pal[uVar68 - 0xd][0];
                        data_00[lVar58 + 1] = local_88a8.pal[uVar68 - 0xd][1];
                        data_00[lVar58 + 2] = local_88a8.pal[uVar68 - 0xd][2];
                        if (iVar40 == 4) {
                          data_00[lVar58 + 3] = 0xff;
                          uVar70 = (ulong)((int)uVar66 + 4);
                        }
                        if (iVar42 + 1U == s->img_x) {
                          uVar66 = uVar70 & 0xffffffff;
                          break;
                        }
                        if (iVar62 == 8) {
                          if (psVar56 < psVar53) {
                            s->img_buffer = psVar56 + 1;
                            bVar39 = *psVar56;
                            psVar56 = psVar56 + 1;
                          }
                          else if (s->read_from_callbacks == 0) {
                            bVar39 = 0;
                          }
                          else {
                            iVar43 = (*(s->io).read)(s->io_user_data,(char *)psVar61,s->buflen);
                            if (iVar43 == 0) {
                              s->read_from_callbacks = 0;
                              s->buffer_start[0] = '\0';
                              bVar39 = 0;
                              psVar53 = psVar64;
                            }
                            else {
                              bVar39 = *psVar61;
                              psVar53 = psVar61 + iVar43;
                            }
                            s->img_buffer_end = psVar53;
                            s->img_buffer = psVar64;
                            psVar56 = psVar64;
                          }
                          uVar65 = (uint)bVar39;
                        }
                        lVar58 = (long)(int)uVar70;
                        uVar66 = lVar58 + 3;
                        uVar68 = (ulong)uVar65;
                        data_00[lVar58] = local_88a8.pal[uVar68 - 0xd][0];
                        data_00[lVar58 + 1] = local_88a8.pal[uVar68 - 0xd][1];
                        data_00[lVar58 + 2] = local_88a8.pal[uVar68 - 0xd][2];
                        if (iVar40 == 4) {
                          data_00[lVar58 + 3] = 0xff;
                          uVar66 = (ulong)((int)uVar70 + 4);
                        }
                        iVar42 = iVar42 + 2;
                      } while (iVar42 < (int)s->img_x);
                    }
                    stbi__skip(s,(uint)local_8990);
                    iVar69 = iVar69 + 1;
                    sVar41 = s->img_y;
                  } while (iVar69 < (int)sVar41);
                }
              }
            }
            else {
              stbi__skip(s,local_88f8._4_4_ - (local_88f8._8_4_ + local_88d8));
              uVar45 = (uint)local_88c0;
              if (iVar62 == 0x10) {
                local_88fc = s->img_x * 2 & 2;
LAB_00118f23:
                if (z_00 == 0 || (z == 0 || (uint)local_88c0 == 0)) {
                  free(data_00);
                  pcVar47 = "bad masks";
                  goto LAB_001165ba;
                }
                iVar69 = stbi__high_bit((uint)local_88c0);
                iVar69 = iVar69 + -7;
                uVar45 = (uVar45 >> 1 & 0x55555555) + (uVar45 & 0x55555555);
                uVar45 = (uVar45 >> 2 & 0x33333333) + (uVar45 & 0x33333333);
                uVar45 = (uVar45 >> 4) + uVar45 & 0xf0f0f0f;
                uVar45 = (uVar45 >> 8) + uVar45;
                local_8944 = (uVar45 >> 0x10) + uVar45 & 0xff;
                iVar42 = stbi__high_bit(z);
                local_88c8 = (anon_struct_96_18_0d0905d3 *)CONCAT44(local_88c8._4_4_,iVar42 + -7);
                uVar45 = ((uint)z >> 1 & 0x55555555) + (z & 0x55555555);
                uVar45 = (uVar45 >> 2 & 0x33333333) + (uVar45 & 0x33333333);
                uVar45 = (uVar45 >> 4) + uVar45 & 0xf0f0f0f;
                uVar45 = (uVar45 >> 8) + uVar45;
                local_8934 = (uVar45 >> 0x10) + uVar45 & 0xff;
                local_8914 = stbi__high_bit(z_00);
                local_8914 = local_8914 + -7;
                uVar45 = ((uint)z_00 >> 1 & 0x55555555) + (z_00 & 0x55555555);
                uVar45 = (uVar45 >> 2 & 0x33333333) + (uVar45 & 0x33333333);
                uVar45 = (uVar45 >> 4) + uVar45 & 0xf0f0f0f;
                uVar45 = (uVar45 >> 8) + uVar45;
                local_88b8 = CONCAT44(local_88b8._4_4_,(uVar45 >> 0x10) + uVar45) &
                             0xffffffff000000ff;
                local_88cc = stbi__high_bit(z_01);
                local_88cc = local_88cc + -7;
                uVar45 = ((uint)z_01 >> 1 & 0x55555555) + (z_01 & 0x55555555);
                uVar45 = (uVar45 >> 2 & 0x33333333) + (uVar45 & 0x33333333);
                uVar45 = (uVar45 >> 4) + uVar45 & 0xf0f0f0f;
                uVar45 = (uVar45 >> 8) + uVar45;
                local_88d0 = (uVar45 >> 0x10) + uVar45 & 0xff;
                local_88d4 = 1;
                bVar77 = false;
              }
              else {
                if (iVar62 == 0x20) {
                  local_88fc = 0;
                  if (!(bool)(((uint)local_88c0 == 0xff0000 && (z == 0xff00 && z_00 == 0xff)) &
                             bVar77)) goto LAB_00118f23;
                  bVar77 = true;
                }
                else {
                  local_88fc = 0;
                  if (iVar62 != 0x18) goto LAB_00118f23;
                  local_88fc = s->img_x & 3;
                  bVar77 = false;
                }
                local_88d4 = 0;
                iVar69 = 0;
                local_88c8 = (anon_struct_96_18_0d0905d3 *)((ulong)local_88c8 & 0xffffffff00000000);
                local_8914 = 0;
                local_88cc = 0;
                local_8944 = 0;
                local_8934 = 0;
                local_88b8 = local_88b8 & 0xffffffff00000000;
                local_88d0 = 0;
              }
              sVar41 = s->img_y;
              if (0 < (int)sVar41) {
                psVar61 = s->buffer_start;
                psVar64 = s->buffer_start + 1;
                iVar43 = 0;
                iVar42 = 0;
                do {
                  local_88ac = iVar42;
                  if ((char)local_88d4 == '\0') {
                    if (0 < (int)s->img_x) {
                      psVar56 = s->img_buffer;
                      psVar53 = s->img_buffer_end;
                      iVar42 = 0;
                      do {
                        if (psVar56 < psVar53) {
                          s->img_buffer = psVar56 + 1;
                          bVar39 = *psVar56;
                          psVar56 = psVar56 + 1;
                        }
                        else if (s->read_from_callbacks == 0) {
                          bVar39 = 0;
                        }
                        else {
                          iVar72 = (*(s->io).read)(s->io_user_data,(char *)psVar61,s->buflen);
                          if (iVar72 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            bVar39 = 0;
                            psVar53 = psVar64;
                          }
                          else {
                            bVar39 = *psVar61;
                            psVar53 = psVar61 + iVar72;
                          }
                          s->img_buffer_end = psVar53;
                          s->img_buffer = psVar64;
                          psVar56 = psVar64;
                        }
                        data_00[(long)iVar43 + 2] = bVar39;
                        if (psVar56 < psVar53) {
                          s->img_buffer = psVar56 + 1;
                          bVar39 = *psVar56;
                          psVar56 = psVar56 + 1;
                        }
                        else if (s->read_from_callbacks == 0) {
                          bVar39 = 0;
                        }
                        else {
                          iVar72 = (*(s->io).read)(s->io_user_data,(char *)psVar61,s->buflen);
                          if (iVar72 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            bVar39 = 0;
                            psVar53 = psVar64;
                          }
                          else {
                            bVar39 = *psVar61;
                            psVar53 = psVar61 + iVar72;
                          }
                          s->img_buffer_end = psVar53;
                          s->img_buffer = psVar64;
                          psVar56 = psVar64;
                        }
                        data_00[(long)iVar43 + 1] = bVar39;
                        if (psVar56 < psVar53) {
                          s->img_buffer = psVar56 + 1;
                          bVar39 = *psVar56;
                          psVar56 = psVar56 + 1;
                        }
                        else if (s->read_from_callbacks == 0) {
                          bVar39 = 0;
                        }
                        else {
                          iVar72 = (*(s->io).read)(s->io_user_data,(char *)psVar61,s->buflen);
                          if (iVar72 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            bVar39 = 0;
                            psVar53 = psVar64;
                          }
                          else {
                            bVar39 = *psVar61;
                            psVar53 = psVar61 + iVar72;
                          }
                          s->img_buffer_end = psVar53;
                          s->img_buffer = psVar64;
                          psVar56 = psVar64;
                        }
                        data_00[iVar43] = bVar39;
                        bVar39 = 0xff;
                        if (bVar77) {
                          if (psVar56 < psVar53) {
                            s->img_buffer = psVar56 + 1;
                            bVar39 = *psVar56;
                            psVar56 = psVar56 + 1;
                          }
                          else if (s->read_from_callbacks == 0) {
                            bVar39 = 0;
                          }
                          else {
                            iVar72 = (*(s->io).read)(s->io_user_data,(char *)psVar61,s->buflen);
                            if (iVar72 == 0) {
                              s->read_from_callbacks = 0;
                              s->buffer_start[0] = '\0';
                              bVar39 = 0;
                              psVar53 = psVar64;
                            }
                            else {
                              bVar39 = *psVar61;
                              psVar53 = psVar61 + iVar72;
                            }
                            s->img_buffer_end = psVar53;
                            s->img_buffer = psVar64;
                            psVar56 = psVar64;
                          }
                        }
                        iVar72 = iVar43 + 3;
                        if (iVar40 == 4) {
                          data_00[(long)iVar43 + 3] = bVar39;
                          iVar72 = iVar43 + 4;
                        }
                        iVar43 = iVar72;
                        uVar74 = uVar74 | bVar39;
                        iVar42 = iVar42 + 1;
                      } while (iVar42 < (int)s->img_x);
                    }
                  }
                  else if (0 < (int)s->img_x) {
                    iVar42 = 0;
                    do {
                      uVar45 = stbi__get16le(s);
                      if (iVar62 != 0x10) {
                        iVar72 = stbi__get16le(s);
                        uVar45 = uVar45 | iVar72 << 0x10;
                      }
                      iVar72 = stbi__shiftsigned(uVar45 & (uint)local_88c0,iVar69,local_8944);
                      data_00[iVar43] = (uchar)iVar72;
                      iVar72 = stbi__shiftsigned(uVar45 & z,(int)local_88c8,local_8934);
                      data_00[(long)iVar43 + 1] = (uchar)iVar72;
                      iVar72 = stbi__shiftsigned(uVar45 & z_00,local_8914,(int)local_88b8);
                      data_00[(long)iVar43 + 2] = (uchar)iVar72;
                      if (z_01 == 0) {
                        uVar45 = 0xff;
                      }
                      else {
                        uVar45 = stbi__shiftsigned(uVar45 & z_01,local_88cc,local_88d0);
                      }
                      iVar72 = iVar43 + 3;
                      if (iVar40 == 4) {
                        data_00[(long)iVar43 + 3] = (uchar)uVar45;
                        iVar72 = iVar43 + 4;
                      }
                      iVar43 = iVar72;
                      uVar74 = uVar74 | uVar45;
                      iVar42 = iVar42 + 1;
                    } while (iVar42 < (int)s->img_x);
                  }
                  stbi__skip(s,local_88fc);
                  iVar42 = local_88ac + 1;
                  sVar41 = s->img_y;
                } while (iVar42 < (int)sVar41);
              }
            }
            auVar37 = _DAT_001b84d0;
            auVar36 = _DAT_001b84c0;
            auVar35 = _DAT_001b84b0;
            auVar34 = _DAT_001b84a0;
            auVar33 = _DAT_001b8490;
            auVar32 = _DAT_001b8480;
            auVar116 = _DAT_001b8470;
            if (((iVar40 == 4) && (uVar74 == 0)) &&
               (uVar74 = s->img_x * sVar41 * 4 - 1, -1 < (int)uVar74)) {
              uVar45 = uVar74 >> 2;
              auVar78._4_4_ = 0;
              auVar78._0_4_ = uVar45;
              auVar78._8_4_ = uVar45;
              auVar78._12_4_ = 0;
              puVar54 = data_00 + uVar74;
              uVar66 = 0;
              do {
                auVar96._8_4_ = (int)uVar66;
                auVar96._0_8_ = uVar66;
                auVar96._12_4_ = (int)(uVar66 >> 0x20);
                auVar98 = auVar78 | auVar37;
                auVar100 = (auVar96 | auVar36) ^ auVar37;
                iVar62 = auVar98._0_4_;
                iVar72 = -(uint)(iVar62 < auVar100._0_4_);
                iVar69 = auVar98._4_4_;
                auVar102._4_4_ = -(uint)(iVar69 < auVar100._4_4_);
                iVar42 = auVar98._8_4_;
                iVar44 = -(uint)(iVar42 < auVar100._8_4_);
                iVar43 = auVar98._12_4_;
                auVar102._12_4_ = -(uint)(iVar43 < auVar100._12_4_);
                auVar79._4_4_ = iVar72;
                auVar79._0_4_ = iVar72;
                auVar79._8_4_ = iVar44;
                auVar79._12_4_ = iVar44;
                auVar79 = pshuflw(in_XMM1,auVar79,0xe8);
                auVar101._4_4_ = -(uint)(auVar100._4_4_ == iVar69);
                auVar101._12_4_ = -(uint)(auVar100._12_4_ == iVar43);
                auVar101._0_4_ = auVar101._4_4_;
                auVar101._8_4_ = auVar101._12_4_;
                auVar88 = pshuflw(in_XMM2,auVar101,0xe8);
                auVar102._0_4_ = auVar102._4_4_;
                auVar102._8_4_ = auVar102._12_4_;
                auVar100 = pshuflw(auVar79,auVar102,0xe8);
                auVar98._8_4_ = 0xffffffff;
                auVar98._0_8_ = 0xffffffffffffffff;
                auVar98._12_4_ = 0xffffffff;
                auVar98 = (auVar100 | auVar88 & auVar79) ^ auVar98;
                auVar98 = packssdw(auVar98,auVar98);
                if ((auVar98 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *puVar54 = 0xff;
                }
                auVar88._4_4_ = iVar72;
                auVar88._0_4_ = iVar72;
                auVar88._8_4_ = iVar44;
                auVar88._12_4_ = iVar44;
                auVar102 = auVar101 & auVar88 | auVar102;
                auVar98 = packssdw(auVar102,auVar102);
                auVar100._8_4_ = 0xffffffff;
                auVar100._0_8_ = 0xffffffffffffffff;
                auVar100._12_4_ = 0xffffffff;
                auVar98 = packssdw(auVar98 ^ auVar100,auVar98 ^ auVar100);
                auVar98 = packsswb(auVar98,auVar98);
                if ((auVar98._0_4_ >> 8 & 1) != 0) {
                  puVar54[-4] = 0xff;
                }
                auVar98 = (auVar96 | auVar35) ^ auVar37;
                auVar89._0_4_ = -(uint)(iVar62 < auVar98._0_4_);
                auVar89._4_4_ = -(uint)(iVar69 < auVar98._4_4_);
                auVar89._8_4_ = -(uint)(iVar42 < auVar98._8_4_);
                auVar89._12_4_ = -(uint)(iVar43 < auVar98._12_4_);
                auVar103._4_4_ = auVar89._0_4_;
                auVar103._0_4_ = auVar89._0_4_;
                auVar103._8_4_ = auVar89._8_4_;
                auVar103._12_4_ = auVar89._8_4_;
                iVar72 = -(uint)(auVar98._4_4_ == iVar69);
                iVar44 = -(uint)(auVar98._12_4_ == iVar43);
                auVar17._4_4_ = iVar72;
                auVar17._0_4_ = iVar72;
                auVar17._8_4_ = iVar44;
                auVar17._12_4_ = iVar44;
                auVar113._4_4_ = auVar89._4_4_;
                auVar113._0_4_ = auVar89._4_4_;
                auVar113._8_4_ = auVar89._12_4_;
                auVar113._12_4_ = auVar89._12_4_;
                auVar98 = auVar17 & auVar103 | auVar113;
                auVar98 = packssdw(auVar98,auVar98);
                auVar8._8_4_ = 0xffffffff;
                auVar8._0_8_ = 0xffffffffffffffff;
                auVar8._12_4_ = 0xffffffff;
                auVar98 = packssdw(auVar98 ^ auVar8,auVar98 ^ auVar8);
                auVar98 = packsswb(auVar98,auVar98);
                if ((auVar98._0_4_ >> 0x10 & 1) != 0) {
                  puVar54[-8] = 0xff;
                }
                auVar98 = pshufhw(auVar98,auVar103,0x84);
                auVar18._4_4_ = iVar72;
                auVar18._0_4_ = iVar72;
                auVar18._8_4_ = iVar44;
                auVar18._12_4_ = iVar44;
                auVar100 = pshufhw(auVar89,auVar18,0x84);
                auVar79 = pshufhw(auVar98,auVar113,0x84);
                auVar80._8_4_ = 0xffffffff;
                auVar80._0_8_ = 0xffffffffffffffff;
                auVar80._12_4_ = 0xffffffff;
                auVar80 = (auVar79 | auVar100 & auVar98) ^ auVar80;
                auVar98 = packssdw(auVar80,auVar80);
                auVar98 = packsswb(auVar98,auVar98);
                if ((auVar98._0_4_ >> 0x18 & 1) != 0) {
                  puVar54[-0xc] = 0xff;
                }
                auVar98 = (auVar96 | auVar34) ^ auVar37;
                auVar90._0_4_ = -(uint)(iVar62 < auVar98._0_4_);
                auVar90._4_4_ = -(uint)(iVar69 < auVar98._4_4_);
                auVar90._8_4_ = -(uint)(iVar42 < auVar98._8_4_);
                auVar90._12_4_ = -(uint)(iVar43 < auVar98._12_4_);
                auVar19._4_4_ = auVar90._0_4_;
                auVar19._0_4_ = auVar90._0_4_;
                auVar19._8_4_ = auVar90._8_4_;
                auVar19._12_4_ = auVar90._8_4_;
                auVar100 = pshuflw(auVar113,auVar19,0xe8);
                auVar81._0_4_ = -(uint)(auVar98._0_4_ == iVar62);
                auVar81._4_4_ = -(uint)(auVar98._4_4_ == iVar69);
                auVar81._8_4_ = -(uint)(auVar98._8_4_ == iVar42);
                auVar81._12_4_ = -(uint)(auVar98._12_4_ == iVar43);
                auVar104._4_4_ = auVar81._4_4_;
                auVar104._0_4_ = auVar81._4_4_;
                auVar104._8_4_ = auVar81._12_4_;
                auVar104._12_4_ = auVar81._12_4_;
                auVar98 = pshuflw(auVar81,auVar104,0xe8);
                auVar105._4_4_ = auVar90._4_4_;
                auVar105._0_4_ = auVar90._4_4_;
                auVar105._8_4_ = auVar90._12_4_;
                auVar105._12_4_ = auVar90._12_4_;
                auVar79 = pshuflw(auVar90,auVar105,0xe8);
                auVar9._8_4_ = 0xffffffff;
                auVar9._0_8_ = 0xffffffffffffffff;
                auVar9._12_4_ = 0xffffffff;
                auVar98 = packssdw(auVar98 & auVar100,(auVar79 | auVar98 & auVar100) ^ auVar9);
                auVar98 = packsswb(auVar98,auVar98);
                if ((auVar98 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  puVar54[-0x10] = 0xff;
                }
                auVar20._4_4_ = auVar90._0_4_;
                auVar20._0_4_ = auVar90._0_4_;
                auVar20._8_4_ = auVar90._8_4_;
                auVar20._12_4_ = auVar90._8_4_;
                auVar105 = auVar104 & auVar20 | auVar105;
                auVar79 = packssdw(auVar105,auVar105);
                auVar10._8_4_ = 0xffffffff;
                auVar10._0_8_ = 0xffffffffffffffff;
                auVar10._12_4_ = 0xffffffff;
                auVar98 = packssdw(auVar98,auVar79 ^ auVar10);
                auVar98 = packsswb(auVar98,auVar98);
                if ((auVar98._4_2_ >> 8 & 1) != 0) {
                  puVar54[-0x14] = 0xff;
                }
                auVar98 = (auVar96 | auVar33) ^ auVar37;
                auVar91._0_4_ = -(uint)(iVar62 < auVar98._0_4_);
                auVar91._4_4_ = -(uint)(iVar69 < auVar98._4_4_);
                auVar91._8_4_ = -(uint)(iVar42 < auVar98._8_4_);
                auVar91._12_4_ = -(uint)(iVar43 < auVar98._12_4_);
                auVar106._4_4_ = auVar91._0_4_;
                auVar106._0_4_ = auVar91._0_4_;
                auVar106._8_4_ = auVar91._8_4_;
                auVar106._12_4_ = auVar91._8_4_;
                iVar72 = -(uint)(auVar98._4_4_ == iVar69);
                iVar44 = -(uint)(auVar98._12_4_ == iVar43);
                auVar21._4_4_ = iVar72;
                auVar21._0_4_ = iVar72;
                auVar21._8_4_ = iVar44;
                auVar21._12_4_ = iVar44;
                auVar114._4_4_ = auVar91._4_4_;
                auVar114._0_4_ = auVar91._4_4_;
                auVar114._8_4_ = auVar91._12_4_;
                auVar114._12_4_ = auVar91._12_4_;
                auVar98 = auVar21 & auVar106 | auVar114;
                auVar98 = packssdw(auVar98,auVar98);
                auVar11._8_4_ = 0xffffffff;
                auVar11._0_8_ = 0xffffffffffffffff;
                auVar11._12_4_ = 0xffffffff;
                auVar98 = packssdw(auVar98 ^ auVar11,auVar98 ^ auVar11);
                auVar98 = packsswb(auVar98,auVar98);
                if ((auVar98 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  puVar54[-0x18] = 0xff;
                }
                auVar98 = pshufhw(auVar98,auVar106,0x84);
                auVar22._4_4_ = iVar72;
                auVar22._0_4_ = iVar72;
                auVar22._8_4_ = iVar44;
                auVar22._12_4_ = iVar44;
                auVar100 = pshufhw(auVar91,auVar22,0x84);
                auVar79 = pshufhw(auVar98,auVar114,0x84);
                auVar82._8_4_ = 0xffffffff;
                auVar82._0_8_ = 0xffffffffffffffff;
                auVar82._12_4_ = 0xffffffff;
                auVar82 = (auVar79 | auVar100 & auVar98) ^ auVar82;
                auVar98 = packssdw(auVar82,auVar82);
                auVar98 = packsswb(auVar98,auVar98);
                if ((auVar98._6_2_ >> 8 & 1) != 0) {
                  puVar54[-0x1c] = 0xff;
                }
                auVar98 = (auVar96 | auVar32) ^ auVar37;
                auVar92._0_4_ = -(uint)(iVar62 < auVar98._0_4_);
                auVar92._4_4_ = -(uint)(iVar69 < auVar98._4_4_);
                auVar92._8_4_ = -(uint)(iVar42 < auVar98._8_4_);
                auVar92._12_4_ = -(uint)(iVar43 < auVar98._12_4_);
                auVar23._4_4_ = auVar92._0_4_;
                auVar23._0_4_ = auVar92._0_4_;
                auVar23._8_4_ = auVar92._8_4_;
                auVar23._12_4_ = auVar92._8_4_;
                auVar100 = pshuflw(auVar114,auVar23,0xe8);
                auVar83._0_4_ = -(uint)(auVar98._0_4_ == iVar62);
                auVar83._4_4_ = -(uint)(auVar98._4_4_ == iVar69);
                auVar83._8_4_ = -(uint)(auVar98._8_4_ == iVar42);
                auVar83._12_4_ = -(uint)(auVar98._12_4_ == iVar43);
                auVar107._4_4_ = auVar83._4_4_;
                auVar107._0_4_ = auVar83._4_4_;
                auVar107._8_4_ = auVar83._12_4_;
                auVar107._12_4_ = auVar83._12_4_;
                auVar98 = pshuflw(auVar83,auVar107,0xe8);
                auVar108._4_4_ = auVar92._4_4_;
                auVar108._0_4_ = auVar92._4_4_;
                auVar108._8_4_ = auVar92._12_4_;
                auVar108._12_4_ = auVar92._12_4_;
                auVar79 = pshuflw(auVar92,auVar108,0xe8);
                auVar93._8_4_ = 0xffffffff;
                auVar93._0_8_ = 0xffffffffffffffff;
                auVar93._12_4_ = 0xffffffff;
                auVar93 = (auVar79 | auVar98 & auVar100) ^ auVar93;
                auVar79 = packssdw(auVar93,auVar93);
                auVar98 = packsswb(auVar98 & auVar100,auVar79);
                if ((auVar98 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  puVar54[-0x20] = 0xff;
                }
                auVar24._4_4_ = auVar92._0_4_;
                auVar24._0_4_ = auVar92._0_4_;
                auVar24._8_4_ = auVar92._8_4_;
                auVar24._12_4_ = auVar92._8_4_;
                auVar108 = auVar107 & auVar24 | auVar108;
                auVar79 = packssdw(auVar108,auVar108);
                auVar12._8_4_ = 0xffffffff;
                auVar12._0_8_ = 0xffffffffffffffff;
                auVar12._12_4_ = 0xffffffff;
                auVar79 = packssdw(auVar79 ^ auVar12,auVar79 ^ auVar12);
                auVar98 = packsswb(auVar98,auVar79);
                if ((auVar98._8_2_ >> 8 & 1) != 0) {
                  puVar54[-0x24] = 0xff;
                }
                auVar98 = (auVar96 | auVar116) ^ auVar37;
                auVar94._0_4_ = -(uint)(iVar62 < auVar98._0_4_);
                auVar94._4_4_ = -(uint)(iVar69 < auVar98._4_4_);
                auVar94._8_4_ = -(uint)(iVar42 < auVar98._8_4_);
                auVar94._12_4_ = -(uint)(iVar43 < auVar98._12_4_);
                auVar109._4_4_ = auVar94._0_4_;
                auVar109._0_4_ = auVar94._0_4_;
                auVar109._8_4_ = auVar94._8_4_;
                auVar109._12_4_ = auVar94._8_4_;
                iVar72 = -(uint)(auVar98._4_4_ == iVar69);
                iVar44 = -(uint)(auVar98._12_4_ == iVar43);
                auVar25._4_4_ = iVar72;
                auVar25._0_4_ = iVar72;
                auVar25._8_4_ = iVar44;
                auVar25._12_4_ = iVar44;
                auVar115._4_4_ = auVar94._4_4_;
                auVar115._0_4_ = auVar94._4_4_;
                auVar115._8_4_ = auVar94._12_4_;
                auVar115._12_4_ = auVar94._12_4_;
                auVar98 = auVar25 & auVar109 | auVar115;
                auVar98 = packssdw(auVar98,auVar98);
                auVar13._8_4_ = 0xffffffff;
                auVar13._0_8_ = 0xffffffffffffffff;
                auVar13._12_4_ = 0xffffffff;
                auVar98 = packssdw(auVar98 ^ auVar13,auVar98 ^ auVar13);
                auVar98 = packsswb(auVar98,auVar98);
                if ((auVar98 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  puVar54[-0x28] = 0xff;
                }
                auVar98 = pshufhw(auVar98,auVar109,0x84);
                auVar26._4_4_ = iVar72;
                auVar26._0_4_ = iVar72;
                auVar26._8_4_ = iVar44;
                auVar26._12_4_ = iVar44;
                auVar100 = pshufhw(auVar94,auVar26,0x84);
                auVar79 = pshufhw(auVar98,auVar115,0x84);
                auVar84._8_4_ = 0xffffffff;
                auVar84._0_8_ = 0xffffffffffffffff;
                auVar84._12_4_ = 0xffffffff;
                auVar84 = (auVar79 | auVar100 & auVar98) ^ auVar84;
                auVar98 = packssdw(auVar84,auVar84);
                auVar98 = packsswb(auVar98,auVar98);
                if ((auVar98._10_2_ >> 8 & 1) != 0) {
                  puVar54[-0x2c] = 0xff;
                }
                auVar98 = (auVar96 | _DAT_001b8460) ^ auVar37;
                auVar95._0_4_ = -(uint)(iVar62 < auVar98._0_4_);
                auVar95._4_4_ = -(uint)(iVar69 < auVar98._4_4_);
                auVar95._8_4_ = -(uint)(iVar42 < auVar98._8_4_);
                auVar95._12_4_ = -(uint)(iVar43 < auVar98._12_4_);
                auVar27._4_4_ = auVar95._0_4_;
                auVar27._0_4_ = auVar95._0_4_;
                auVar27._8_4_ = auVar95._8_4_;
                auVar27._12_4_ = auVar95._8_4_;
                auVar100 = pshuflw(auVar115,auVar27,0xe8);
                auVar85._0_4_ = -(uint)(auVar98._0_4_ == iVar62);
                auVar85._4_4_ = -(uint)(auVar98._4_4_ == iVar69);
                auVar85._8_4_ = -(uint)(auVar98._8_4_ == iVar42);
                auVar85._12_4_ = -(uint)(auVar98._12_4_ == iVar43);
                auVar110._4_4_ = auVar85._4_4_;
                auVar110._0_4_ = auVar85._4_4_;
                auVar110._8_4_ = auVar85._12_4_;
                auVar110._12_4_ = auVar85._12_4_;
                auVar98 = pshuflw(auVar85,auVar110,0xe8);
                auVar111._4_4_ = auVar95._4_4_;
                auVar111._0_4_ = auVar95._4_4_;
                auVar111._8_4_ = auVar95._12_4_;
                auVar111._12_4_ = auVar95._12_4_;
                auVar79 = pshuflw(auVar95,auVar111,0xe8);
                auVar14._8_4_ = 0xffffffff;
                auVar14._0_8_ = 0xffffffffffffffff;
                auVar14._12_4_ = 0xffffffff;
                auVar98 = packssdw(auVar98 & auVar100,(auVar79 | auVar98 & auVar100) ^ auVar14);
                auVar98 = packsswb(auVar98,auVar98);
                if ((auVar98 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  puVar54[-0x30] = 0xff;
                }
                auVar28._4_4_ = auVar95._0_4_;
                auVar28._0_4_ = auVar95._0_4_;
                auVar28._8_4_ = auVar95._8_4_;
                auVar28._12_4_ = auVar95._8_4_;
                auVar111 = auVar110 & auVar28 | auVar111;
                auVar79 = packssdw(auVar111,auVar111);
                auVar15._8_4_ = 0xffffffff;
                auVar15._0_8_ = 0xffffffffffffffff;
                auVar15._12_4_ = 0xffffffff;
                auVar98 = packssdw(auVar98,auVar79 ^ auVar15);
                auVar98 = packsswb(auVar98,auVar98);
                if ((auVar98._12_2_ >> 8 & 1) != 0) {
                  puVar54[-0x34] = 0xff;
                }
                auVar98 = (auVar96 | _DAT_001b8450) ^ auVar37;
                auVar86._0_4_ = -(uint)(iVar62 < auVar98._0_4_);
                auVar86._4_4_ = -(uint)(iVar69 < auVar98._4_4_);
                auVar86._8_4_ = -(uint)(iVar42 < auVar98._8_4_);
                auVar86._12_4_ = -(uint)(iVar43 < auVar98._12_4_);
                auVar112._4_4_ = auVar86._0_4_;
                auVar112._0_4_ = auVar86._0_4_;
                auVar112._8_4_ = auVar86._8_4_;
                auVar112._12_4_ = auVar86._8_4_;
                auVar97._4_4_ = -(uint)(auVar98._4_4_ == iVar69);
                auVar97._12_4_ = -(uint)(auVar98._12_4_ == iVar43);
                auVar97._0_4_ = auVar97._4_4_;
                auVar97._8_4_ = auVar97._12_4_;
                auVar99._4_4_ = auVar86._4_4_;
                auVar99._0_4_ = auVar86._4_4_;
                auVar99._8_4_ = auVar86._12_4_;
                auVar99._12_4_ = auVar86._12_4_;
                auVar79 = auVar97 & auVar112 | auVar99;
                auVar98 = packssdw(auVar86,auVar79);
                auVar16._8_4_ = 0xffffffff;
                auVar16._0_8_ = 0xffffffffffffffff;
                auVar16._12_4_ = 0xffffffff;
                auVar98 = packssdw(auVar98 ^ auVar16,auVar98 ^ auVar16);
                auVar98 = packsswb(auVar98,auVar98);
                if ((auVar98 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  puVar54[-0x38] = 0xff;
                }
                auVar98 = pshufhw(auVar98,auVar112,0x84);
                in_XMM2 = pshufhw(auVar79,auVar97,0x84);
                in_XMM2 = in_XMM2 & auVar98;
                auVar98 = pshufhw(auVar98,auVar99,0x84);
                auVar87._8_4_ = 0xffffffff;
                auVar87._0_8_ = 0xffffffffffffffff;
                auVar87._12_4_ = 0xffffffff;
                auVar87 = (auVar98 | in_XMM2) ^ auVar87;
                auVar98 = packssdw(auVar87,auVar87);
                in_XMM1 = packsswb(auVar98,auVar98);
                if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
                  puVar54[-0x3c] = 0xff;
                }
                uVar66 = uVar66 + 0x10;
                puVar54 = puVar54 + -0x40;
              } while ((uVar45 + 0x10 & 0x3ffffff0) != uVar66);
            }
            if ((int)local_88b0 < 1) {
              uVar74 = s->img_x;
            }
            else {
              uVar74 = s->img_x;
              if (0 < (int)sVar41 >> 1) {
                uVar45 = uVar74 * iVar40;
                uVar65 = (sVar41 - 1) * uVar45;
                uVar66 = 0;
                uVar68 = 0;
                do {
                  if (0 < (int)uVar45) {
                    uVar70 = 0;
                    do {
                      uVar3 = data_00[uVar70 + uVar66];
                      data_00[uVar70 + uVar66] = data_00[uVar70 + uVar65];
                      data_00[uVar70 + uVar65] = uVar3;
                      uVar70 = uVar70 + 1;
                    } while (uVar45 != uVar70);
                  }
                  uVar68 = uVar68 + 1;
                  uVar65 = uVar65 - uVar45;
                  uVar66 = (ulong)((int)uVar66 + uVar45);
                } while (uVar68 != (uint)((int)sVar41 >> 1));
              }
            }
            if ((req_comp == 0) || (iVar40 == req_comp)) {
LAB_00119ced:
              *x = uVar74;
              *y = s->img_y;
              if (comp == (int *)0x0) {
                return data_00;
              }
              *comp = s->img_n;
              return data_00;
            }
            data_00 = stbi__convert_format(data_00,iVar40,req_comp,uVar74,sVar41);
            if (data_00 != (uchar *)0x0) {
              uVar74 = s->img_x;
              goto LAB_00119ced;
            }
            goto LAB_001165c3;
          }
          pcVar47 = "outofmem";
        }
      }
      else {
        if (s->read_from_callbacks != 0) {
          psVar56 = s->buffer_start;
          iVar40 = (*(s->io).read)(s->io_user_data,(char *)psVar56,s->buflen);
          if (iVar40 == 0) {
            s->read_from_callbacks = 0;
            psVar64 = s->buffer_start + 1;
            s->buffer_start[0] = '\0';
            sVar38 = '\0';
          }
          else {
            psVar64 = psVar56 + iVar40;
            sVar38 = *psVar56;
          }
          s->img_buffer_end = psVar64;
          psVar53 = s->buffer_start + 1;
          s->img_buffer = psVar53;
          goto LAB_00117bd8;
        }
LAB_00117def:
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
LAB_00117e01:
        iVar40 = stbi__gif_test(s);
        if (iVar40 != 0) {
          memset(&local_88a8,0,0x8870);
          psVar52 = (stbi__context *)stbi__gif_load_next(s,&local_88a8,comp,0,psVar61);
          if (psVar52 == (stbi__context *)0x0 || psVar52 == s) {
            if ((stbi__jpeg *)local_88a8.out != (stbi__jpeg *)0x0) {
              free(local_88a8.out);
            }
            psVar52 = (stbi__context *)0x0;
          }
          else {
            *x = local_88a8.w;
            *y = local_88a8.h;
            if ((req_comp & 0xfffffffbU) != 0) {
              psVar52 = (stbi__context *)
                        stbi__convert_format((uchar *)psVar52,4,req_comp,local_88a8.w,local_88a8.h);
            }
          }
          free(local_88a8.history);
          psVar46 = (stbi__jpeg *)local_88a8.background;
          goto LAB_00118375;
        }
        iVar40 = stbi__psd_test(s);
        if (iVar40 != 0) {
          pvVar50 = stbi__psd_load(s,x,y,comp,req_comp,ri,bpc);
          return pvVar50;
        }
        iVar40 = stbi__pic_test(s);
        if (iVar40 != 0) {
          pvVar50 = stbi__pic_load(s,x,y,comp,req_comp,ri_00);
          return pvVar50;
        }
        iVar40 = stbi__pnm_test(s);
        if (iVar40 != 0) {
          pvVar50 = stbi__pnm_load(s,x,y,comp,req_comp,ri_00);
          return pvVar50;
        }
        iVar40 = stbi__hdr_test(s);
        if (iVar40 != 0) {
          data_01 = stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
          if (req_comp == 0) {
            req_comp = *comp;
          }
          psVar61 = stbi__hdr_to_ldr(data_01,*x,*y,req_comp);
          return psVar61;
        }
        iVar40 = stbi__tga_test(s);
        if (iVar40 != 0) {
          pvVar50 = stbi__tga_load(s,x,y,comp,req_comp,ri_00);
          return pvVar50;
        }
        pcVar47 = "unknown image type";
      }
LAB_001165ba:
      *(char **)(in_FS_OFFSET + -0x10) = pcVar47;
    }
    else {
      if (4 < (uint)req_comp) {
        pcVar47 = "bad req_comp";
        goto LAB_001165ba;
      }
      local_88a8._0_8_ = s;
      iVar40 = stbi__parse_png_file((stbi__png *)&local_88a8,0,req_comp);
      uVar7 = local_88a8._0_8_;
      if (iVar40 == 0) {
        psVar52 = (stbi__context *)0x0;
LAB_00117c63:
        free(local_88a8.history);
        free(local_88a8.background);
        psVar46 = (stbi__jpeg *)local_88a8.out;
        goto LAB_00118375;
      }
      iVar40 = 8;
      if (8 < local_88a8.flags) {
        iVar40 = local_88a8.flags;
      }
      ri->bits_per_channel = iVar40;
      psVar52 = (stbi__context *)local_88a8.history;
      if ((req_comp == 0) || (iVar40 = *(int *)(local_88a8._0_8_ + 0xc), iVar40 == req_comp)) {
LAB_00117c3e:
        *x = *(stbi__uint32 *)uVar7;
        *y = *(stbi__uint32 *)(uVar7 + 4);
        if (comp != (int *)0x0) {
          *comp = *(int *)(uVar7 + 8);
        }
        local_88a8.history = (stbi_uc *)0x0;
        goto LAB_00117c63;
      }
      if (local_88a8.flags < 9) {
        psVar52 = (stbi__context *)
                  stbi__convert_format
                            (local_88a8.history,iVar40,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                             *(stbi__uint32 *)(local_88a8._0_8_ + 4));
      }
      else {
        psVar52 = (stbi__context *)
                  stbi__convert_format16
                            ((stbi__uint16 *)local_88a8.history,iVar40,req_comp,
                             *(stbi__uint32 *)local_88a8._0_8_,
                             *(stbi__uint32 *)(local_88a8._0_8_ + 4));
      }
      *(int *)(uVar7 + 0xc) = req_comp;
      if (psVar52 != (stbi__context *)0x0) goto LAB_00117c3e;
    }
LAB_001165c3:
    psVar52 = (stbi__context *)0x0;
  }
  return psVar52;
LAB_001179a9:
  bVar77 = false;
LAB_001179ab:
  if (!bVar77) goto LAB_00118360;
LAB_001179b3:
  bVar39 = psVar46->marker;
LAB_001179bb:
  if (bVar39 == 0xff) {
LAB_001179c3:
    do {
      psVar52 = psVar46->s;
      if ((psVar52->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001179e3:
        if (psVar52->img_buffer_end <= psVar52->img_buffer) goto LAB_001166be;
      }
      else {
        iVar40 = (*(psVar52->io).eof)(psVar52->io_user_data);
        if (iVar40 != 0) {
          if (psVar52->read_from_callbacks != 0) goto LAB_001179e3;
          goto LAB_001166be;
        }
      }
      psVar52 = psVar46->s;
      psVar61 = psVar52->img_buffer;
      if (psVar61 < psVar52->img_buffer_end) {
        psVar52->img_buffer = psVar61 + 1;
        sVar38 = *psVar61;
      }
      else {
        if (psVar52->read_from_callbacks == 0) goto LAB_001179c3;
        psVar61 = psVar52->buffer_start;
        iVar40 = (*(psVar52->io).read)(psVar52->io_user_data,(char *)psVar61,psVar52->buflen);
        if (iVar40 == 0) {
          psVar52->read_from_callbacks = 0;
          psVar64 = psVar52->buffer_start + 1;
          psVar52->buffer_start[0] = '\0';
          sVar38 = '\0';
        }
        else {
          psVar64 = psVar61 + iVar40;
          sVar38 = *psVar61;
        }
        psVar52->img_buffer_end = psVar64;
        psVar52->img_buffer = psVar52->buffer_start + 1;
      }
    } while (sVar38 != 0xff);
    psVar52 = psVar46->s;
    psVar61 = psVar52->img_buffer;
    if (psVar61 < psVar52->img_buffer_end) {
      psVar52->img_buffer = psVar61 + 1;
      sVar38 = *psVar61;
    }
    else if (psVar52->read_from_callbacks == 0) {
      sVar38 = '\0';
    }
    else {
      psVar61 = psVar52->buffer_start;
      iVar40 = (*(psVar52->io).read)(psVar52->io_user_data,(char *)psVar61,psVar52->buflen);
      if (iVar40 == 0) {
        psVar52->read_from_callbacks = 0;
        psVar64 = psVar52->buffer_start + 1;
        psVar52->buffer_start[0] = '\0';
        sVar38 = '\0';
      }
      else {
        psVar64 = psVar61 + iVar40;
        sVar38 = *psVar61;
      }
      psVar52->img_buffer_end = psVar64;
      psVar52->img_buffer = psVar52->buffer_start + 1;
    }
    psVar46->marker = sVar38;
  }
LAB_001166be:
  bVar39 = stbi__get_marker(psVar46);
  goto LAB_00116668;
LAB_00119f1c:
  paVar60 = (anon_struct_96_18_0d0905d3 *)(ulong)(uVar45 - 0x10);
  psVar46->code_bits = uVar45 - 0x10;
LAB_00119f27:
  pcVar47 = "bad huffman code";
LAB_00118357:
  uVar74 = (uint)paVar60;
  *(char **)(in_FS_OFFSET + -0x10) = pcVar47;
  goto LAB_00118360;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}